

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  int iVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  RayQueryContext *pRVar51;
  byte bVar52;
  long lVar53;
  ulong uVar54;
  long lVar55;
  bool bVar56;
  ulong uVar57;
  Geometry *pGVar58;
  ulong uVar59;
  Geometry *geometry;
  long lVar60;
  byte bVar61;
  ulong uVar62;
  float fVar63;
  float fVar121;
  float fVar123;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar64;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar83 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined4 uVar129;
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined8 uVar135;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  vint4 bi;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 ai_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar160;
  float fVar162;
  vint4 ai_1;
  undefined1 auVar161 [16];
  undefined1 auVar163 [32];
  float fVar164;
  uint uVar165;
  float fVar167;
  float fVar168;
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5c0 [16];
  Precalculations *local_5b0;
  ulong local_5a8;
  Geometry *local_5a0;
  RayQueryContext *local_598;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  LinearSpace3fa *local_430;
  Primitive *local_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  uint local_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  uint uStack_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar62 = (ulong)(byte)prim[1];
  lVar53 = uVar62 * 0x25;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xf + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x11 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1a + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1b + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1c + 6)));
  uVar129 = *(undefined4 *)(prim + lVar53 + 0x12);
  auVar178._4_4_ = uVar129;
  auVar178._0_4_ = uVar129;
  auVar178._8_4_ = uVar129;
  auVar178._12_4_ = uVar129;
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar65 = vsubps_avx512vl(auVar77,*(undefined1 (*) [16])(prim + lVar53 + 6));
  fVar145 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar53 + 0x16)) *
            *(float *)(prim + lVar53 + 0x1a);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar18 = vpmovsxwd_avx(auVar77);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar82);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar130 = vpmovsxwd_avx(auVar79);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar137 = vpmovsxwd_avx(auVar78);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar77 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar77 = vinsertps_avx512f(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar65 = vmulps_avx512vl(auVar178,auVar65);
  auVar66 = vmulps_avx512vl(auVar178,auVar77);
  auVar67 = vcvtdq2ps_avx512vl(auVar17);
  auVar68 = vcvtdq2ps_avx512vl(auVar73);
  auVar69 = vcvtdq2ps_avx512vl(auVar69);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar77 = vcvtdq2ps_avx(auVar72);
  auVar82 = vcvtdq2ps_avx(auVar74);
  auVar79 = vcvtdq2ps_avx(auVar75);
  auVar78 = vcvtdq2ps_avx(auVar76);
  uVar129 = auVar66._0_4_;
  auVar150._4_4_ = uVar129;
  auVar150._0_4_ = uVar129;
  auVar150._8_4_ = uVar129;
  auVar150._12_4_ = uVar129;
  auVar17 = vshufps_avx(auVar66,auVar66,0x55);
  auVar73 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar72 = vmulps_avx512vl(auVar73,auVar69);
  auVar136._0_4_ = auVar73._0_4_ * auVar77._0_4_;
  auVar136._4_4_ = auVar73._4_4_ * auVar77._4_4_;
  auVar136._8_4_ = auVar73._8_4_ * auVar77._8_4_;
  auVar136._12_4_ = auVar73._12_4_ * auVar77._12_4_;
  auVar66._0_4_ = auVar78._0_4_ * auVar73._0_4_;
  auVar66._4_4_ = auVar78._4_4_ * auVar73._4_4_;
  auVar66._8_4_ = auVar78._8_4_ * auVar73._8_4_;
  auVar66._12_4_ = auVar78._12_4_ * auVar73._12_4_;
  auVar73 = vfmadd231ps_avx512vl(auVar72,auVar17,auVar68);
  auVar72 = vfmadd231ps_avx512vl(auVar136,auVar17,auVar71);
  auVar17 = vfmadd231ps_fma(auVar66,auVar79,auVar17);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar150,auVar67);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar150,auVar70);
  auVar17 = vfmadd231ps_fma(auVar17,auVar82,auVar150);
  auVar74 = vbroadcastss_avx512vl(auVar65);
  auVar75 = vshufps_avx512vl(auVar65,auVar65,0x55);
  auVar76 = vshufps_avx512vl(auVar65,auVar65,0xaa);
  auVar69 = vmulps_avx512vl(auVar76,auVar69);
  auVar77 = vmulps_avx512vl(auVar76,auVar77);
  auVar78 = vmulps_avx512vl(auVar76,auVar78);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar75,auVar68);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar75,auVar71);
  auVar79 = vfmadd231ps_avx512vl(auVar78,auVar75,auVar79);
  auVar66 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar67);
  auVar67 = vfmadd231ps_avx512vl(auVar77,auVar74,auVar70);
  auVar65 = vfmadd231ps_fma(auVar79,auVar74,auVar82);
  auVar177._8_4_ = 0x7fffffff;
  auVar177._0_8_ = 0x7fffffff7fffffff;
  auVar177._12_4_ = 0x7fffffff;
  auVar77 = vandps_avx(auVar177,auVar73);
  auVar175._8_4_ = 0x219392ef;
  auVar175._0_8_ = 0x219392ef219392ef;
  auVar175._12_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar77,auVar175,1);
  bVar56 = (bool)((byte)uVar59 & 1);
  auVar68._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._0_4_;
  bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._4_4_;
  bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._8_4_;
  bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._12_4_;
  auVar77 = vandps_avx(auVar177,auVar72);
  uVar59 = vcmpps_avx512vl(auVar77,auVar175,1);
  bVar56 = (bool)((byte)uVar59 & 1);
  auVar80._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar72._0_4_;
  bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar72._4_4_;
  bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar72._8_4_;
  bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar72._12_4_;
  auVar77 = vandps_avx(auVar177,auVar17);
  uVar59 = vcmpps_avx512vl(auVar77,auVar175,1);
  bVar56 = (bool)((byte)uVar59 & 1);
  auVar81._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar17._0_4_;
  bVar56 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar17._4_4_;
  bVar56 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar17._8_4_;
  bVar56 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar17._12_4_;
  auVar172._8_4_ = 0x3f800000;
  auVar172._0_8_ = 0x3f8000003f800000;
  auVar172._12_4_ = 0x3f800000;
  auVar82 = vrcp14ps_avx512vl(auVar68);
  auVar77 = vfnmadd213ps_fma(auVar68,auVar82,auVar172);
  auVar79 = vfmadd132ps_fma(auVar77,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar80);
  auVar77 = vfnmadd213ps_fma(auVar80,auVar82,auVar172);
  auVar78 = vfmadd132ps_fma(auVar77,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar81);
  auVar77 = vfnmadd213ps_fma(auVar81,auVar82,auVar172);
  auVar75 = vfmadd132ps_fma(auVar77,auVar82,auVar82);
  auVar155._4_4_ = fVar145;
  auVar155._0_4_ = fVar145;
  auVar155._8_4_ = fVar145;
  auVar155._12_4_ = fVar145;
  auVar77 = vcvtdq2ps_avx(auVar18);
  auVar82 = vcvtdq2ps_avx(auVar19);
  auVar82 = vsubps_avx(auVar82,auVar77);
  auVar76 = vfmadd213ps_fma(auVar82,auVar155,auVar77);
  auVar77 = vcvtdq2ps_avx(auVar130);
  auVar82 = vcvtdq2ps_avx(auVar137);
  auVar82 = vsubps_avx(auVar82,auVar77);
  auVar18 = vfmadd213ps_fma(auVar82,auVar155,auVar77);
  auVar77 = vcvtdq2ps_avx(auVar6);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar62 * 0x16 + 6);
  auVar82 = vpmovsxwd_avx(auVar17);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar77);
  auVar6 = vfmadd213ps_fma(auVar82,auVar155,auVar77);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar62 * 0x14 + 6);
  auVar77 = vpmovsxwd_avx(auVar73);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar62 * 0x18 + 6);
  auVar82 = vpmovsxwd_avx(auVar69);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar77);
  auVar17 = vfmadd213ps_fma(auVar82,auVar155,auVar77);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar62 * 0x1d + 6);
  auVar77 = vpmovsxwd_avx(auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar62 * 0x21 + 6);
  auVar82 = vpmovsxwd_avx(auVar71);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar77);
  auVar73 = vfmadd213ps_fma(auVar82,auVar155,auVar77);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar62 * 0x1f + 6);
  auVar77 = vpmovsxwd_avx(auVar72);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar62 * 0x23 + 6);
  auVar82 = vpmovsxwd_avx(auVar74);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar77);
  auVar82 = vfmadd213ps_fma(auVar82,auVar155,auVar77);
  auVar77 = vsubps_avx(auVar76,auVar66);
  auVar156._0_4_ = auVar79._0_4_ * auVar77._0_4_;
  auVar156._4_4_ = auVar79._4_4_ * auVar77._4_4_;
  auVar156._8_4_ = auVar79._8_4_ * auVar77._8_4_;
  auVar156._12_4_ = auVar79._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar18,auVar66);
  auVar141._0_4_ = auVar79._0_4_ * auVar77._0_4_;
  auVar141._4_4_ = auVar79._4_4_ * auVar77._4_4_;
  auVar141._8_4_ = auVar79._8_4_ * auVar77._8_4_;
  auVar141._12_4_ = auVar79._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar6,auVar67);
  auVar161._0_4_ = auVar78._0_4_ * auVar77._0_4_;
  auVar161._4_4_ = auVar78._4_4_ * auVar77._4_4_;
  auVar161._8_4_ = auVar78._8_4_ * auVar77._8_4_;
  auVar161._12_4_ = auVar78._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar17,auVar67);
  auVar137._0_4_ = auVar78._0_4_ * auVar77._0_4_;
  auVar137._4_4_ = auVar78._4_4_ * auVar77._4_4_;
  auVar137._8_4_ = auVar78._8_4_ * auVar77._8_4_;
  auVar137._12_4_ = auVar78._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar73,auVar65);
  auVar67._0_4_ = auVar75._0_4_ * auVar77._0_4_;
  auVar67._4_4_ = auVar75._4_4_ * auVar77._4_4_;
  auVar67._8_4_ = auVar75._8_4_ * auVar77._8_4_;
  auVar67._12_4_ = auVar75._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar82,auVar65);
  auVar130._0_4_ = auVar75._0_4_ * auVar77._0_4_;
  auVar130._4_4_ = auVar75._4_4_ * auVar77._4_4_;
  auVar130._8_4_ = auVar75._8_4_ * auVar77._8_4_;
  auVar130._12_4_ = auVar75._12_4_ * auVar77._12_4_;
  auVar77 = vpminsd_avx(auVar156,auVar141);
  auVar82 = vpminsd_avx(auVar161,auVar137);
  auVar77 = vmaxps_avx(auVar77,auVar82);
  auVar82 = vpminsd_avx(auVar67,auVar130);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar75._4_4_ = uVar129;
  auVar75._0_4_ = uVar129;
  auVar75._8_4_ = uVar129;
  auVar75._12_4_ = uVar129;
  auVar82 = vmaxps_avx512vl(auVar82,auVar75);
  auVar77 = vmaxps_avx(auVar77,auVar82);
  auVar76._8_4_ = 0x3f7ffffa;
  auVar76._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar76._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar77,auVar76);
  auVar77 = vpmaxsd_avx(auVar156,auVar141);
  auVar82 = vpmaxsd_avx(auVar161,auVar137);
  auVar77 = vminps_avx(auVar77,auVar82);
  auVar82 = vpmaxsd_avx(auVar67,auVar130);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar18._4_4_ = uVar129;
  auVar18._0_4_ = uVar129;
  auVar18._8_4_ = uVar129;
  auVar18._12_4_ = uVar129;
  auVar82 = vminps_avx512vl(auVar82,auVar18);
  auVar77 = vminps_avx(auVar77,auVar82);
  auVar19._8_4_ = 0x3f800003;
  auVar19._0_8_ = 0x3f8000033f800003;
  auVar19._12_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar19);
  auVar82 = vpbroadcastd_avx512vl();
  uVar135 = vcmpps_avx512vl(local_270,auVar77,2);
  uVar20 = vpcmpgtd_avx512vl(auVar82,_DAT_01f4ad30);
  uVar59 = (ulong)((byte)uVar135 & 0xf & (byte)uVar20);
  local_430 = pre->ray_space + k;
  local_370 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b0 = pre;
  local_598 = context;
  local_428 = prim;
  for (; pRVar51 = local_598, uVar59 != 0;
      uVar59 = (ulong)((uint)uVar59 & (uint)uVar59 + 0xf & (uint)uVar135)) {
    lVar53 = 0;
    for (uVar62 = uVar59; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      lVar53 = lVar53 + 1;
    }
    local_5a8 = (ulong)*(uint *)(local_428 + 2);
    pGVar58 = (context->scene->geometries).items[local_5a8].ptr;
    uVar62 = (ulong)*(uint *)(*(long *)&pGVar58->field_0x58 +
                             (ulong)*(uint *)(local_428 + lVar53 * 4 + 6) *
                             pGVar58[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar145 = (pGVar58->time_range).lower;
    fVar145 = pGVar58->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar145) / ((pGVar58->time_range).upper - fVar145))
    ;
    auVar77 = vroundss_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),9);
    auVar77 = vminss_avx(auVar77,ZEXT416((uint)(pGVar58->fnumTimeSegments + -1.0)));
    auVar77 = vmaxss_avx(ZEXT816(0) << 0x20,auVar77);
    fVar145 = fVar145 - auVar77._0_4_;
    _Var8 = pGVar58[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar55 = (long)(int)auVar77._0_4_ * 0x38;
    lVar53 = *(long *)(_Var8 + 0x10 + lVar55);
    lVar60 = *(long *)(_Var8 + 0x38 + lVar55);
    lVar9 = *(long *)(_Var8 + 0x48 + lVar55);
    auVar138._4_4_ = fVar145;
    auVar138._0_4_ = fVar145;
    auVar138._8_4_ = fVar145;
    auVar138._12_4_ = fVar145;
    pfVar3 = (float *)(lVar60 + uVar62 * lVar9);
    auVar173._0_4_ = fVar145 * *pfVar3;
    auVar173._4_4_ = fVar145 * pfVar3[1];
    auVar173._8_4_ = fVar145 * pfVar3[2];
    auVar173._12_4_ = fVar145 * pfVar3[3];
    pfVar3 = (float *)(lVar60 + (uVar62 + 1) * lVar9);
    auVar174._0_4_ = fVar145 * *pfVar3;
    auVar174._4_4_ = fVar145 * pfVar3[1];
    auVar174._8_4_ = fVar145 * pfVar3[2];
    auVar174._12_4_ = fVar145 * pfVar3[3];
    auVar77 = vmulps_avx512vl(auVar138,*(undefined1 (*) [16])(lVar60 + (uVar62 + 2) * lVar9));
    auVar82 = vmulps_avx512vl(auVar138,*(undefined1 (*) [16])(lVar60 + lVar9 * (uVar62 + 3)));
    lVar60 = *(long *)(_Var8 + lVar55);
    fVar145 = 1.0 - fVar145;
    auVar65._4_4_ = fVar145;
    auVar65._0_4_ = fVar145;
    auVar65._8_4_ = fVar145;
    auVar65._12_4_ = fVar145;
    local_4d0 = vfmadd231ps_fma(auVar173,auVar65,*(undefined1 (*) [16])(lVar60 + lVar53 * uVar62));
    local_4e0 = vfmadd231ps_fma(auVar174,auVar65,
                                *(undefined1 (*) [16])(lVar60 + lVar53 * (uVar62 + 1)));
    local_4f0 = vfmadd231ps_avx512vl
                          (auVar77,auVar65,*(undefined1 (*) [16])(lVar60 + lVar53 * (uVar62 + 2)));
    _local_350 = vfmadd231ps_avx512vl
                           (auVar82,auVar65,*(undefined1 (*) [16])(lVar60 + lVar53 * (uVar62 + 3)));
    iVar7 = (int)pGVar58[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar79 = vsubps_avx(local_4d0,auVar77);
    uVar129 = auVar79._0_4_;
    auVar142._4_4_ = uVar129;
    auVar142._0_4_ = uVar129;
    auVar142._8_4_ = uVar129;
    auVar142._12_4_ = uVar129;
    auVar82 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    aVar4 = (local_430->vx).field_0;
    aVar5 = (local_430->vy).field_0;
    fVar145 = (local_430->vz).field_0.m128[0];
    fVar164 = *(float *)((long)&(local_430->vz).field_0 + 4);
    fVar167 = *(float *)((long)&(local_430->vz).field_0 + 8);
    fVar168 = *(float *)((long)&(local_430->vz).field_0 + 0xc);
    auVar166._0_4_ = fVar145 * auVar79._0_4_;
    auVar166._4_4_ = fVar164 * auVar79._4_4_;
    auVar166._8_4_ = fVar167 * auVar79._8_4_;
    auVar166._12_4_ = fVar168 * auVar79._12_4_;
    auVar82 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar5,auVar82);
    auVar78 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar142);
    auVar79 = vsubps_avx(local_4e0,auVar77);
    uVar129 = auVar79._0_4_;
    auVar143._4_4_ = uVar129;
    auVar143._0_4_ = uVar129;
    auVar143._8_4_ = uVar129;
    auVar143._12_4_ = uVar129;
    auVar82 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar169._0_4_ = fVar145 * auVar79._0_4_;
    auVar169._4_4_ = fVar164 * auVar79._4_4_;
    auVar169._8_4_ = fVar167 * auVar79._8_4_;
    auVar169._12_4_ = fVar168 * auVar79._12_4_;
    auVar82 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar82);
    auVar6 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar143);
    auVar79 = vsubps_avx512vl(local_4f0,auVar77);
    uVar129 = auVar79._0_4_;
    auVar144._4_4_ = uVar129;
    auVar144._0_4_ = uVar129;
    auVar144._8_4_ = uVar129;
    auVar144._12_4_ = uVar129;
    auVar82 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar171._0_4_ = fVar145 * auVar79._0_4_;
    auVar171._4_4_ = fVar164 * auVar79._4_4_;
    auVar171._8_4_ = fVar167 * auVar79._8_4_;
    auVar171._12_4_ = fVar168 * auVar79._12_4_;
    auVar82 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar82);
    auVar79 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar144);
    auVar82 = vsubps_avx512vl(_local_350,auVar77);
    uVar129 = auVar82._0_4_;
    auVar139._4_4_ = uVar129;
    auVar139._0_4_ = uVar129;
    auVar139._8_4_ = uVar129;
    auVar139._12_4_ = uVar129;
    auVar77 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar176._0_4_ = fVar145 * auVar82._0_4_;
    auVar176._4_4_ = fVar164 * auVar82._4_4_;
    auVar176._8_4_ = fVar167 * auVar82._8_4_;
    auVar176._12_4_ = fVar168 * auVar82._12_4_;
    auVar77 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar77);
    auVar17 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar139);
    lVar53 = (long)iVar7 * 0x44;
    auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar53);
    uVar129 = auVar78._0_4_;
    local_3e0._4_4_ = uVar129;
    local_3e0._0_4_ = uVar129;
    local_3e0._8_4_ = uVar129;
    local_3e0._12_4_ = uVar129;
    local_3e0._16_4_ = uVar129;
    local_3e0._20_4_ = uVar129;
    local_3e0._24_4_ = uVar129;
    local_3e0._28_4_ = uVar129;
    auVar85._8_4_ = 1;
    auVar85._0_8_ = 0x100000001;
    auVar85._12_4_ = 1;
    auVar85._16_4_ = 1;
    auVar85._20_4_ = 1;
    auVar85._24_4_ = 1;
    auVar85._28_4_ = 1;
    local_3c0 = vpermps_avx2(auVar85,ZEXT1632(auVar78));
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x484);
    uVar129 = auVar6._0_4_;
    local_540._4_4_ = uVar129;
    local_540._0_4_ = uVar129;
    local_540._8_4_ = uVar129;
    local_540._12_4_ = uVar129;
    local_540._16_4_ = uVar129;
    local_540._20_4_ = uVar129;
    local_540._24_4_ = uVar129;
    local_540._28_4_ = uVar129;
    local_560 = vpermps_avx512vl(auVar85,ZEXT1632(auVar6));
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x908);
    local_480 = vbroadcastss_avx512vl(auVar79);
    local_400 = vpermps_avx512vl(auVar85,ZEXT1632(auVar79));
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0xd8c);
    local_4a0 = vbroadcastss_avx512vl(auVar17);
    auVar188 = ZEXT3264(local_4a0);
    local_4c0 = vpermps_avx512vl(auVar85,ZEXT1632(auVar17));
    auVar190 = ZEXT3264(local_4c0);
    auVar85 = vmulps_avx512vl(local_4a0,auVar97);
    auVar86 = vmulps_avx512vl(local_4c0,auVar97);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_480);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_400);
    auVar77 = vfmadd231ps_fma(auVar85,auVar100,local_540);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar100,local_560);
    auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar99,local_3e0);
    auVar88 = vfmadd231ps_avx512vl(auVar85,auVar99,local_3c0);
    auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar53);
    auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x484);
    auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x908);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0xd8c);
    auVar89 = vmulps_avx512vl(local_4a0,auVar95);
    auVar90 = vmulps_avx512vl(local_4c0,auVar95);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_480);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_400);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_540);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,local_560);
    auVar73 = vfmadd231ps_fma(auVar89,auVar85,local_3e0);
    auVar69 = vfmadd231ps_fma(auVar90,auVar85,local_3c0);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar73),auVar87);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar69),auVar88);
    auVar91 = vmulps_avx512vl(auVar88,auVar89);
    auVar92 = vmulps_avx512vl(auVar87,auVar90);
    auVar91 = vsubps_avx512vl(auVar91,auVar92);
    auVar77 = vshufps_avx(local_4d0,local_4d0,0xff);
    uVar135 = auVar77._0_8_;
    local_80._8_8_ = uVar135;
    local_80._0_8_ = uVar135;
    local_80._16_8_ = uVar135;
    local_80._24_8_ = uVar135;
    auVar77 = vshufps_avx(local_4e0,local_4e0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar77);
    auVar77 = vshufps_avx512vl(local_4f0,local_4f0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar77);
    auVar77 = vshufps_avx512vl(_local_350,_local_350,0xff);
    uVar135 = auVar77._0_8_;
    register0x000012c8 = uVar135;
    local_e0 = uVar135;
    register0x000012d0 = uVar135;
    register0x000012d8 = uVar135;
    auVar92 = vmulps_avx512vl(_local_e0,auVar97);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_c0);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,local_a0);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_80);
    auVar93 = vmulps_avx512vl(_local_e0,auVar95);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,local_a0);
    auVar70 = vfmadd231ps_fma(auVar93,auVar85,local_80);
    auVar93 = vmulps_avx512vl(auVar90,auVar90);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar89);
    auVar94 = vmaxps_avx512vl(auVar92,ZEXT1632(auVar70));
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar93 = vmulps_avx512vl(auVar94,auVar93);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    uVar135 = vcmpps_avx512vl(auVar91,auVar93,2);
    auVar77 = vblendps_avx(auVar78,local_4d0,8);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar82 = vandps_avx512vl(auVar77,auVar71);
    auVar77 = vblendps_avx(auVar6,local_4e0,8);
    auVar77 = vandps_avx512vl(auVar77,auVar71);
    auVar82 = vmaxps_avx(auVar82,auVar77);
    auVar77 = vblendps_avx(auVar79,local_4f0,8);
    auVar72 = vandps_avx512vl(auVar77,auVar71);
    auVar77 = vblendps_avx(auVar17,_local_350,8);
    auVar77 = vandps_avx512vl(auVar77,auVar71);
    auVar77 = vmaxps_avx(auVar72,auVar77);
    auVar77 = vmaxps_avx(auVar82,auVar77);
    auVar82 = vmovshdup_avx(auVar77);
    auVar82 = vmaxss_avx(auVar82,auVar77);
    auVar77 = vshufpd_avx(auVar77,auVar77,1);
    local_500 = vcvtsi2ss_avx512f(local_4f0,iVar7);
    auVar77 = vmaxss_avx(auVar77,auVar82);
    fVar145 = local_500._0_4_;
    auVar93._4_4_ = fVar145;
    auVar93._0_4_ = fVar145;
    auVar93._8_4_ = fVar145;
    auVar93._12_4_ = fVar145;
    auVar93._16_4_ = fVar145;
    auVar93._20_4_ = fVar145;
    auVar93._24_4_ = fVar145;
    auVar93._28_4_ = fVar145;
    uVar20 = vcmpps_avx512vl(auVar93,_DAT_01f7b060,0xe);
    bVar61 = (byte)uVar135 & (byte)uVar20;
    auVar77 = vmulss_avx512f(auVar77,ZEXT416(0x35000000));
    auVar91._8_4_ = 2;
    auVar91._0_8_ = 0x200000002;
    auVar91._12_4_ = 2;
    auVar91._16_4_ = 2;
    auVar91._20_4_ = 2;
    auVar91._24_4_ = 2;
    auVar91._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar91,ZEXT1632(auVar78));
    local_120 = vpermps_avx512vl(auVar91,ZEXT1632(auVar6));
    local_140 = vpermps_avx512vl(auVar91,ZEXT1632(auVar79));
    local_460 = vpermps_avx2(auVar91,ZEXT1632(auVar17));
    local_360 = vpbroadcastd_avx512vl();
    uVar165 = *(uint *)(ray + k * 4 + 0x30);
    auVar82 = auVar95._0_16_;
    if (bVar61 == 0) {
      bVar56 = false;
      auVar82 = vxorps_avx512vl(auVar82,auVar82);
      auVar183 = ZEXT1664(auVar82);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar184 = ZEXT3264(auVar99);
      auVar185 = ZEXT3264(local_3e0);
      auVar186 = ZEXT3264(local_3c0);
      auVar182 = ZEXT3264(local_540);
      auVar181 = ZEXT3264(local_560);
      auVar187 = ZEXT3264(local_480);
      auVar189 = ZEXT3264(local_400);
    }
    else {
      local_420._0_16_ = ZEXT416(uVar165);
      local_3a0._0_16_ = auVar77;
      auVar95 = vmulps_avx512vl(local_460,auVar95);
      auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar95);
      auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar96);
      auVar95 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
      auVar97 = vmulps_avx512vl(local_460,auVar97);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
      auVar86 = vfmadd213ps_avx512vl(auVar100,local_120,auVar98);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1210);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1694);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1b18);
      auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1f9c);
      auVar91 = vfmadd213ps_avx512vl(auVar99,local_100,auVar86);
      auVar99 = vmulps_avx512vl(local_4a0,auVar85);
      auVar86 = vmulps_avx512vl(local_4c0,auVar85);
      auVar85 = vmulps_avx512vl(local_460,auVar85);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_480);
      auVar79 = vfmadd231ps_fma(auVar86,auVar97,local_400);
      auVar97 = vfmadd231ps_avx512vl(auVar85,local_140,auVar97);
      auVar78 = vfmadd231ps_fma(auVar99,auVar98,local_540);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar98,local_560);
      auVar85 = vfmadd231ps_avx512vl(auVar97,local_120,auVar98);
      auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar100,local_3e0);
      auVar96 = vfmadd231ps_avx512vl(auVar99,auVar100,local_3c0);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1210);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1f9c);
      auVar85 = vfmadd231ps_avx512vl(auVar85,local_100,auVar100);
      auVar100 = vmulps_avx512vl(local_4a0,auVar97);
      auVar93 = vmulps_avx512vl(local_4c0,auVar97);
      auVar97 = vmulps_avx512vl(local_460,auVar97);
      auVar191 = ZEXT1664(auVar77);
      auVar94 = vfmadd231ps_avx512vl(auVar100,auVar98,local_480);
      auVar79 = vfmadd231ps_fma(auVar93,auVar98,local_400);
      auVar189 = ZEXT3264(local_400);
      auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1694);
      auVar97 = vfmadd231ps_avx512vl(auVar94,auVar100,local_540);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar100,local_560);
      auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar99,local_3e0);
      auVar97 = vfmadd231ps_avx512vl(auVar93,auVar99,local_3c0);
      auVar93 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
      auVar179._8_4_ = 0x7fffffff;
      auVar179._0_8_ = 0x7fffffff7fffffff;
      auVar179._12_4_ = 0x7fffffff;
      auVar179._16_4_ = 0x7fffffff;
      auVar179._20_4_ = 0x7fffffff;
      auVar179._24_4_ = 0x7fffffff;
      auVar179._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(auVar86,auVar179);
      auVar100 = vandps_avx(auVar96,auVar179);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vandps_avx(auVar85,auVar179);
      auVar99 = vmaxps_avx(auVar100,auVar99);
      auVar85 = vbroadcastss_avx512vl(auVar77);
      uVar62 = vcmpps_avx512vl(auVar99,auVar85,1);
      bVar56 = (bool)((byte)uVar62 & 1);
      auVar94._0_4_ = (float)((uint)bVar56 * auVar89._0_4_ | (uint)!bVar56 * auVar86._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar94._4_4_ = (float)((uint)bVar56 * auVar89._4_4_ | (uint)!bVar56 * auVar86._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar94._8_4_ = (float)((uint)bVar56 * auVar89._8_4_ | (uint)!bVar56 * auVar86._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar94._12_4_ = (float)((uint)bVar56 * auVar89._12_4_ | (uint)!bVar56 * auVar86._12_4_);
      bVar56 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar94._16_4_ = (float)((uint)bVar56 * auVar89._16_4_ | (uint)!bVar56 * auVar86._16_4_);
      bVar56 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar94._20_4_ = (float)((uint)bVar56 * auVar89._20_4_ | (uint)!bVar56 * auVar86._20_4_);
      bVar56 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar94._24_4_ = (float)((uint)bVar56 * auVar89._24_4_ | (uint)!bVar56 * auVar86._24_4_);
      bVar56 = SUB81(uVar62 >> 7,0);
      auVar94._28_4_ = (uint)bVar56 * auVar89._28_4_ | (uint)!bVar56 * auVar86._28_4_;
      bVar56 = (bool)((byte)uVar62 & 1);
      auVar110._0_4_ = (float)((uint)bVar56 * auVar90._0_4_ | (uint)!bVar56 * auVar96._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar56 * auVar90._4_4_ | (uint)!bVar56 * auVar96._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar56 * auVar90._8_4_ | (uint)!bVar56 * auVar96._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar56 * auVar90._12_4_ | (uint)!bVar56 * auVar96._12_4_);
      bVar56 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar56 * auVar90._16_4_ | (uint)!bVar56 * auVar96._16_4_);
      bVar56 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar56 * auVar90._20_4_ | (uint)!bVar56 * auVar96._20_4_);
      bVar56 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar56 * auVar90._24_4_ | (uint)!bVar56 * auVar96._24_4_);
      bVar56 = SUB81(uVar62 >> 7,0);
      auVar110._28_4_ = (uint)bVar56 * auVar90._28_4_ | (uint)!bVar56 * auVar96._28_4_;
      auVar99 = vandps_avx(auVar179,auVar98);
      auVar100 = vandps_avx(auVar97,auVar179);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vandps_avx(auVar93,auVar179);
      auVar99 = vmaxps_avx(auVar100,auVar99);
      uVar62 = vcmpps_avx512vl(auVar99,auVar85,1);
      bVar56 = (bool)((byte)uVar62 & 1);
      auVar101._0_4_ = (float)((uint)bVar56 * auVar89._0_4_ | (uint)!bVar56 * auVar98._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar56 * auVar89._4_4_ | (uint)!bVar56 * auVar98._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar56 * auVar89._8_4_ | (uint)!bVar56 * auVar98._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar56 * auVar89._12_4_ | (uint)!bVar56 * auVar98._12_4_);
      bVar56 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar101._16_4_ = (float)((uint)bVar56 * auVar89._16_4_ | (uint)!bVar56 * auVar98._16_4_);
      bVar56 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar101._20_4_ = (float)((uint)bVar56 * auVar89._20_4_ | (uint)!bVar56 * auVar98._20_4_);
      bVar56 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar101._24_4_ = (float)((uint)bVar56 * auVar89._24_4_ | (uint)!bVar56 * auVar98._24_4_);
      bVar56 = SUB81(uVar62 >> 7,0);
      auVar101._28_4_ = (uint)bVar56 * auVar89._28_4_ | (uint)!bVar56 * auVar98._28_4_;
      bVar56 = (bool)((byte)uVar62 & 1);
      auVar102._0_4_ = (float)((uint)bVar56 * auVar90._0_4_ | (uint)!bVar56 * auVar97._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar56 * auVar90._4_4_ | (uint)!bVar56 * auVar97._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar56 * auVar90._8_4_ | (uint)!bVar56 * auVar97._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar56 * auVar90._12_4_ | (uint)!bVar56 * auVar97._12_4_);
      bVar56 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar56 * auVar90._16_4_ | (uint)!bVar56 * auVar97._16_4_);
      bVar56 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar56 * auVar90._20_4_ | (uint)!bVar56 * auVar97._20_4_);
      bVar56 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar56 * auVar90._24_4_ | (uint)!bVar56 * auVar97._24_4_);
      bVar56 = SUB81(uVar62 >> 7,0);
      auVar102._28_4_ = (uint)bVar56 * auVar90._28_4_ | (uint)!bVar56 * auVar97._28_4_;
      auVar76 = vxorps_avx512vl(auVar82,auVar82);
      auVar183 = ZEXT1664(auVar76);
      auVar99 = vfmadd213ps_avx512vl(auVar94,auVar94,ZEXT1632(auVar76));
      auVar82 = vfmadd231ps_fma(auVar99,auVar110,auVar110);
      auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
      fVar164 = auVar98._0_4_;
      fVar167 = auVar98._4_4_;
      fVar168 = auVar98._8_4_;
      fVar160 = auVar98._12_4_;
      fVar159 = auVar98._16_4_;
      fVar162 = auVar98._20_4_;
      fVar63 = auVar98._24_4_;
      auVar99._4_4_ = fVar167 * fVar167 * fVar167 * auVar82._4_4_ * -0.5;
      auVar99._0_4_ = fVar164 * fVar164 * fVar164 * auVar82._0_4_ * -0.5;
      auVar99._8_4_ = fVar168 * fVar168 * fVar168 * auVar82._8_4_ * -0.5;
      auVar99._12_4_ = fVar160 * fVar160 * fVar160 * auVar82._12_4_ * -0.5;
      auVar99._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
      auVar99._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar99._24_4_ = fVar63 * fVar63 * fVar63 * -0.0;
      auVar99._28_4_ = 0;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar98);
      auVar100._4_4_ = auVar110._4_4_ * auVar99._4_4_;
      auVar100._0_4_ = auVar110._0_4_ * auVar99._0_4_;
      auVar100._8_4_ = auVar110._8_4_ * auVar99._8_4_;
      auVar100._12_4_ = auVar110._12_4_ * auVar99._12_4_;
      auVar100._16_4_ = auVar110._16_4_ * auVar99._16_4_;
      auVar100._20_4_ = auVar110._20_4_ * auVar99._20_4_;
      auVar100._24_4_ = auVar110._24_4_ * auVar99._24_4_;
      auVar100._28_4_ = auVar98._28_4_;
      auVar98._4_4_ = auVar99._4_4_ * -auVar94._4_4_;
      auVar98._0_4_ = auVar99._0_4_ * -auVar94._0_4_;
      auVar98._8_4_ = auVar99._8_4_ * -auVar94._8_4_;
      auVar98._12_4_ = auVar99._12_4_ * -auVar94._12_4_;
      auVar98._16_4_ = auVar99._16_4_ * -auVar94._16_4_;
      auVar98._20_4_ = auVar99._20_4_ * -auVar94._20_4_;
      auVar98._24_4_ = auVar99._24_4_ * -auVar94._24_4_;
      auVar98._28_4_ = auVar94._28_4_ ^ 0x80000000;
      auVar89 = vmulps_avx512vl(auVar99,ZEXT1632(auVar76));
      auVar90 = ZEXT1632(auVar76);
      auVar97 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar90);
      auVar82 = vfmadd231ps_fma(auVar97,auVar102,auVar102);
      auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
      fVar164 = auVar96._0_4_;
      fVar167 = auVar96._4_4_;
      fVar168 = auVar96._8_4_;
      fVar160 = auVar96._12_4_;
      fVar159 = auVar96._16_4_;
      fVar162 = auVar96._20_4_;
      fVar63 = auVar96._24_4_;
      auVar97._4_4_ = fVar167 * fVar167 * fVar167 * auVar82._4_4_ * -0.5;
      auVar97._0_4_ = fVar164 * fVar164 * fVar164 * auVar82._0_4_ * -0.5;
      auVar97._8_4_ = fVar168 * fVar168 * fVar168 * auVar82._8_4_ * -0.5;
      auVar97._12_4_ = fVar160 * fVar160 * fVar160 * auVar82._12_4_ * -0.5;
      auVar97._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
      auVar97._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar97._24_4_ = fVar63 * fVar63 * fVar63 * -0.0;
      auVar97._28_4_ = 0;
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar96);
      auVar86._4_4_ = auVar102._4_4_ * auVar97._4_4_;
      auVar86._0_4_ = auVar102._0_4_ * auVar97._0_4_;
      auVar86._8_4_ = auVar102._8_4_ * auVar97._8_4_;
      auVar86._12_4_ = auVar102._12_4_ * auVar97._12_4_;
      auVar86._16_4_ = auVar102._16_4_ * auVar97._16_4_;
      auVar86._20_4_ = auVar102._20_4_ * auVar97._20_4_;
      auVar86._24_4_ = auVar102._24_4_ * auVar97._24_4_;
      auVar86._28_4_ = auVar96._28_4_;
      auVar96._4_4_ = -auVar101._4_4_ * auVar97._4_4_;
      auVar96._0_4_ = -auVar101._0_4_ * auVar97._0_4_;
      auVar96._8_4_ = -auVar101._8_4_ * auVar97._8_4_;
      auVar96._12_4_ = -auVar101._12_4_ * auVar97._12_4_;
      auVar96._16_4_ = -auVar101._16_4_ * auVar97._16_4_;
      auVar96._20_4_ = -auVar101._20_4_ * auVar97._20_4_;
      auVar96._24_4_ = -auVar101._24_4_ * auVar97._24_4_;
      auVar96._28_4_ = auVar99._28_4_;
      auVar99 = vmulps_avx512vl(auVar97,auVar90);
      auVar82 = vfmadd213ps_fma(auVar100,auVar92,auVar87);
      auVar79 = vfmadd213ps_fma(auVar98,auVar92,auVar88);
      auVar97 = vfmadd213ps_avx512vl(auVar89,auVar92,auVar91);
      auVar85 = vfmadd213ps_avx512vl(auVar86,ZEXT1632(auVar70),ZEXT1632(auVar73));
      auVar71 = vfnmadd213ps_fma(auVar100,auVar92,auVar87);
      auVar87 = ZEXT1632(auVar70);
      auVar78 = vfmadd213ps_fma(auVar96,auVar87,ZEXT1632(auVar69));
      auVar72 = vfnmadd213ps_fma(auVar98,auVar92,auVar88);
      auVar6 = vfmadd213ps_fma(auVar99,auVar87,auVar95);
      auVar100 = vfnmadd231ps_avx512vl(auVar91,auVar92,auVar89);
      auVar74 = vfnmadd213ps_fma(auVar86,auVar87,ZEXT1632(auVar73));
      auVar69 = vfnmadd213ps_fma(auVar96,auVar87,ZEXT1632(auVar69));
      auVar75 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar70),auVar99);
      auVar98 = vsubps_avx512vl(auVar85,ZEXT1632(auVar71));
      auVar99 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar72));
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar6),auVar100);
      auVar96 = vmulps_avx512vl(auVar99,auVar100);
      auVar17 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar72),auVar86);
      auVar95._4_4_ = auVar71._4_4_ * auVar86._4_4_;
      auVar95._0_4_ = auVar71._0_4_ * auVar86._0_4_;
      auVar95._8_4_ = auVar71._8_4_ * auVar86._8_4_;
      auVar95._12_4_ = auVar71._12_4_ * auVar86._12_4_;
      auVar95._16_4_ = auVar86._16_4_ * 0.0;
      auVar95._20_4_ = auVar86._20_4_ * 0.0;
      auVar95._24_4_ = auVar86._24_4_ * 0.0;
      auVar95._28_4_ = auVar86._28_4_;
      auVar86 = vfmsub231ps_avx512vl(auVar95,auVar100,auVar98);
      auVar87._4_4_ = auVar72._4_4_ * auVar98._4_4_;
      auVar87._0_4_ = auVar72._0_4_ * auVar98._0_4_;
      auVar87._8_4_ = auVar72._8_4_ * auVar98._8_4_;
      auVar87._12_4_ = auVar72._12_4_ * auVar98._12_4_;
      auVar87._16_4_ = auVar98._16_4_ * 0.0;
      auVar87._20_4_ = auVar98._20_4_ * 0.0;
      auVar87._24_4_ = auVar98._24_4_ * 0.0;
      auVar87._28_4_ = auVar98._28_4_;
      auVar73 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar71),auVar99);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar90,auVar86);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,ZEXT1632(auVar17));
      auVar91 = ZEXT1632(auVar76);
      uVar62 = vcmpps_avx512vl(auVar99,auVar91,2);
      bVar52 = (byte)uVar62;
      fVar63 = (float)((uint)(bVar52 & 1) * auVar82._0_4_ |
                      (uint)!(bool)(bVar52 & 1) * auVar74._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar121 = (float)((uint)bVar56 * auVar82._4_4_ | (uint)!bVar56 * auVar74._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar123 = (float)((uint)bVar56 * auVar82._8_4_ | (uint)!bVar56 * auVar74._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar125 = (float)((uint)bVar56 * auVar82._12_4_ | (uint)!bVar56 * auVar74._12_4_);
      auVar96 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar63))));
      fVar64 = (float)((uint)(bVar52 & 1) * auVar79._0_4_ |
                      (uint)!(bool)(bVar52 & 1) * auVar69._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar122 = (float)((uint)bVar56 * auVar79._4_4_ | (uint)!bVar56 * auVar69._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar124 = (float)((uint)bVar56 * auVar79._8_4_ | (uint)!bVar56 * auVar69._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar126 = (float)((uint)bVar56 * auVar79._12_4_ | (uint)!bVar56 * auVar69._12_4_);
      auVar95 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar64))));
      auVar103._0_4_ =
           (float)((uint)(bVar52 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar75._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar56 * auVar97._4_4_ | (uint)!bVar56 * auVar75._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar56 * auVar97._8_4_ | (uint)!bVar56 * auVar75._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar56 * auVar97._12_4_ | (uint)!bVar56 * auVar75._12_4_);
      fVar167 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_);
      auVar103._16_4_ = fVar167;
      fVar164 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_);
      auVar103._20_4_ = fVar164;
      fVar168 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_);
      auVar103._24_4_ = fVar168;
      iVar1 = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
      auVar103._28_4_ = iVar1;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar71),auVar85);
      auVar104._0_4_ =
           (uint)(bVar52 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar79._0_4_;
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar104._4_4_ = (uint)bVar56 * auVar98._4_4_ | (uint)!bVar56 * auVar79._4_4_;
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar104._8_4_ = (uint)bVar56 * auVar98._8_4_ | (uint)!bVar56 * auVar79._8_4_;
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar104._12_4_ = (uint)bVar56 * auVar98._12_4_ | (uint)!bVar56 * auVar79._12_4_;
      auVar104._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_;
      auVar104._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_;
      auVar104._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_;
      auVar104._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar78));
      auVar105._0_4_ =
           (float)((uint)(bVar52 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar17._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar56 * auVar98._4_4_ | (uint)!bVar56 * auVar17._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar56 * auVar98._8_4_ | (uint)!bVar56 * auVar17._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar56 * auVar98._12_4_ | (uint)!bVar56 * auVar17._12_4_);
      fVar160 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_);
      auVar105._16_4_ = fVar160;
      fVar159 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_);
      auVar105._20_4_ = fVar159;
      fVar162 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_);
      auVar105._24_4_ = fVar162;
      auVar105._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(auVar100,ZEXT1632(auVar6));
      auVar106._0_4_ =
           (float)((uint)(bVar52 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar97._0_4_);
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar56 * auVar98._4_4_ | (uint)!bVar56 * auVar97._4_4_);
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar56 * auVar98._8_4_ | (uint)!bVar56 * auVar97._8_4_);
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar56 * auVar98._12_4_ | (uint)!bVar56 * auVar97._12_4_);
      bVar56 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar56 * auVar98._16_4_ | (uint)!bVar56 * auVar97._16_4_);
      bVar56 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar56 * auVar98._20_4_ | (uint)!bVar56 * auVar97._20_4_);
      bVar56 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar56 * auVar98._24_4_ | (uint)!bVar56 * auVar97._24_4_);
      bVar56 = SUB81(uVar62 >> 7,0);
      auVar106._28_4_ = (uint)bVar56 * auVar98._28_4_ | (uint)!bVar56 * auVar97._28_4_;
      auVar107._0_4_ =
           (uint)(bVar52 & 1) * (int)auVar71._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar85._0_4_;
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar56 * (int)auVar71._4_4_ | (uint)!bVar56 * auVar85._4_4_;
      bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar56 * (int)auVar71._8_4_ | (uint)!bVar56 * auVar85._8_4_;
      bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar56 * (int)auVar71._12_4_ | (uint)!bVar56 * auVar85._12_4_;
      auVar107._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar85._16_4_;
      auVar107._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar85._20_4_;
      auVar107._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar85._24_4_;
      auVar107._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar85._28_4_;
      bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar108._0_4_ =
           (uint)(bVar52 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar6._0_4_;
      bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar6._4_4_;
      bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar6._8_4_;
      bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar6._12_4_;
      auVar108._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar100._16_4_;
      auVar108._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar100._20_4_;
      auVar108._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar100._24_4_;
      iVar2 = (uint)(byte)(uVar62 >> 7) * auVar100._28_4_;
      auVar108._28_4_ = iVar2;
      auVar87 = vsubps_avx512vl(auVar107,auVar96);
      auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar72._12_4_ |
                                               (uint)!bVar14 * auVar78._12_4_,
                                               CONCAT48((uint)bVar12 * (int)auVar72._8_4_ |
                                                        (uint)!bVar12 * auVar78._8_4_,
                                                        CONCAT44((uint)bVar56 * (int)auVar72._4_4_ |
                                                                 (uint)!bVar56 * auVar78._4_4_,
                                                                 (uint)(bVar52 & 1) *
                                                                 (int)auVar72._0_4_ |
                                                                 (uint)!(bool)(bVar52 & 1) *
                                                                 auVar78._0_4_)))),auVar95);
      auVar98 = vsubps_avx(auVar108,auVar103);
      auVar97 = vsubps_avx(auVar96,auVar104);
      auVar85 = vsubps_avx(auVar95,auVar105);
      auVar86 = vsubps_avx(auVar103,auVar106);
      auVar88._4_4_ = auVar98._4_4_ * fVar121;
      auVar88._0_4_ = auVar98._0_4_ * fVar63;
      auVar88._8_4_ = auVar98._8_4_ * fVar123;
      auVar88._12_4_ = auVar98._12_4_ * fVar125;
      auVar88._16_4_ = auVar98._16_4_ * 0.0;
      auVar88._20_4_ = auVar98._20_4_ * 0.0;
      auVar88._24_4_ = auVar98._24_4_ * 0.0;
      auVar88._28_4_ = iVar2;
      auVar82 = vfmsub231ps_fma(auVar88,auVar103,auVar87);
      auVar89._4_4_ = fVar122 * auVar87._4_4_;
      auVar89._0_4_ = fVar64 * auVar87._0_4_;
      auVar89._8_4_ = fVar124 * auVar87._8_4_;
      auVar89._12_4_ = fVar126 * auVar87._12_4_;
      auVar89._16_4_ = auVar87._16_4_ * 0.0;
      auVar89._20_4_ = auVar87._20_4_ * 0.0;
      auVar89._24_4_ = auVar87._24_4_ * 0.0;
      auVar89._28_4_ = auVar99._28_4_;
      auVar79 = vfmsub231ps_fma(auVar89,auVar96,auVar100);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar91,ZEXT1632(auVar82));
      auVar151._0_4_ = auVar100._0_4_ * auVar103._0_4_;
      auVar151._4_4_ = auVar100._4_4_ * auVar103._4_4_;
      auVar151._8_4_ = auVar100._8_4_ * auVar103._8_4_;
      auVar151._12_4_ = auVar100._12_4_ * auVar103._12_4_;
      auVar151._16_4_ = auVar100._16_4_ * fVar167;
      auVar151._20_4_ = auVar100._20_4_ * fVar164;
      auVar151._24_4_ = auVar100._24_4_ * fVar168;
      auVar151._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar151,auVar95,auVar98);
      auVar88 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar82));
      auVar99 = vmulps_avx512vl(auVar86,auVar104);
      auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar106);
      auVar90._4_4_ = auVar85._4_4_ * auVar106._4_4_;
      auVar90._0_4_ = auVar85._0_4_ * auVar106._0_4_;
      auVar90._8_4_ = auVar85._8_4_ * auVar106._8_4_;
      auVar90._12_4_ = auVar85._12_4_ * auVar106._12_4_;
      auVar90._16_4_ = auVar85._16_4_ * auVar106._16_4_;
      auVar90._20_4_ = auVar85._20_4_ * auVar106._20_4_;
      auVar90._24_4_ = auVar85._24_4_ * auVar106._24_4_;
      auVar90._28_4_ = auVar106._28_4_;
      auVar82 = vfmsub231ps_fma(auVar90,auVar105,auVar86);
      auVar152._0_4_ = auVar105._0_4_ * auVar97._0_4_;
      auVar152._4_4_ = auVar105._4_4_ * auVar97._4_4_;
      auVar152._8_4_ = auVar105._8_4_ * auVar97._8_4_;
      auVar152._12_4_ = auVar105._12_4_ * auVar97._12_4_;
      auVar152._16_4_ = fVar160 * auVar97._16_4_;
      auVar152._20_4_ = fVar159 * auVar97._20_4_;
      auVar152._24_4_ = fVar162 * auVar97._24_4_;
      auVar152._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar152,auVar85,auVar104);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar91,auVar99);
      auVar89 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar82));
      auVar99 = vmaxps_avx(auVar88,auVar89);
      uVar135 = vcmpps_avx512vl(auVar99,auVar91,2);
      bVar61 = bVar61 & (byte)uVar135;
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar184 = ZEXT3264(auVar90);
      auVar185 = ZEXT3264(local_3e0);
      auVar186 = ZEXT3264(local_3c0);
      auVar182 = ZEXT3264(local_540);
      auVar181 = ZEXT3264(local_560);
      if (bVar61 == 0) {
        bVar56 = false;
        auVar187 = ZEXT3264(local_480);
        auVar188 = ZEXT3264(local_4a0);
        auVar190 = ZEXT3264(local_4c0);
      }
      else {
        auVar27._4_4_ = auVar86._4_4_ * auVar100._4_4_;
        auVar27._0_4_ = auVar86._0_4_ * auVar100._0_4_;
        auVar27._8_4_ = auVar86._8_4_ * auVar100._8_4_;
        auVar27._12_4_ = auVar86._12_4_ * auVar100._12_4_;
        auVar27._16_4_ = auVar86._16_4_ * auVar100._16_4_;
        auVar27._20_4_ = auVar86._20_4_ * auVar100._20_4_;
        auVar27._24_4_ = auVar86._24_4_ * auVar100._24_4_;
        auVar27._28_4_ = auVar99._28_4_;
        auVar78 = vfmsub231ps_fma(auVar27,auVar85,auVar98);
        auVar28._4_4_ = auVar98._4_4_ * auVar97._4_4_;
        auVar28._0_4_ = auVar98._0_4_ * auVar97._0_4_;
        auVar28._8_4_ = auVar98._8_4_ * auVar97._8_4_;
        auVar28._12_4_ = auVar98._12_4_ * auVar97._12_4_;
        auVar28._16_4_ = auVar98._16_4_ * auVar97._16_4_;
        auVar28._20_4_ = auVar98._20_4_ * auVar97._20_4_;
        auVar28._24_4_ = auVar98._24_4_ * auVar97._24_4_;
        auVar28._28_4_ = auVar98._28_4_;
        auVar79 = vfmsub231ps_fma(auVar28,auVar87,auVar86);
        auVar29._4_4_ = auVar85._4_4_ * auVar87._4_4_;
        auVar29._0_4_ = auVar85._0_4_ * auVar87._0_4_;
        auVar29._8_4_ = auVar85._8_4_ * auVar87._8_4_;
        auVar29._12_4_ = auVar85._12_4_ * auVar87._12_4_;
        auVar29._16_4_ = auVar85._16_4_ * auVar87._16_4_;
        auVar29._20_4_ = auVar85._20_4_ * auVar87._20_4_;
        auVar29._24_4_ = auVar85._24_4_ * auVar87._24_4_;
        auVar29._28_4_ = auVar85._28_4_;
        auVar6 = vfmsub231ps_fma(auVar29,auVar97,auVar100);
        auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar6));
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar78),auVar91);
        auVar100 = vrcp14ps_avx512vl(auVar99);
        auVar98 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar90);
        auVar82 = vfmadd132ps_fma(auVar98,auVar100,auVar100);
        auVar30._4_4_ = auVar6._4_4_ * auVar103._4_4_;
        auVar30._0_4_ = auVar6._0_4_ * auVar103._0_4_;
        auVar30._8_4_ = auVar6._8_4_ * auVar103._8_4_;
        auVar30._12_4_ = auVar6._12_4_ * auVar103._12_4_;
        auVar30._16_4_ = fVar167 * 0.0;
        auVar30._20_4_ = fVar164 * 0.0;
        auVar30._24_4_ = fVar168 * 0.0;
        auVar30._28_4_ = iVar1;
        auVar79 = vfmadd231ps_fma(auVar30,auVar95,ZEXT1632(auVar79));
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar96,ZEXT1632(auVar78));
        fVar164 = auVar82._0_4_;
        fVar167 = auVar82._4_4_;
        fVar168 = auVar82._8_4_;
        fVar160 = auVar82._12_4_;
        local_220 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar160,
                                       CONCAT48(auVar79._8_4_ * fVar168,
                                                CONCAT44(auVar79._4_4_ * fVar167,
                                                         auVar79._0_4_ * fVar164))));
        auVar163._4_4_ = uVar165;
        auVar163._0_4_ = uVar165;
        auVar163._8_4_ = uVar165;
        auVar163._12_4_ = uVar165;
        auVar163._16_4_ = uVar165;
        auVar163._20_4_ = uVar165;
        auVar163._24_4_ = uVar165;
        auVar163._28_4_ = uVar165;
        uVar135 = vcmpps_avx512vl(auVar163,local_220,2);
        uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar22._4_4_ = uVar129;
        auVar22._0_4_ = uVar129;
        auVar22._8_4_ = uVar129;
        auVar22._12_4_ = uVar129;
        auVar22._16_4_ = uVar129;
        auVar22._20_4_ = uVar129;
        auVar22._24_4_ = uVar129;
        auVar22._28_4_ = uVar129;
        uVar20 = vcmpps_avx512vl(local_220,auVar22,2);
        bVar61 = (byte)uVar135 & (byte)uVar20 & bVar61;
        auVar187 = ZEXT3264(local_480);
        auVar188 = ZEXT3264(local_4a0);
        auVar190 = ZEXT3264(local_4c0);
        if (bVar61 != 0) {
          uVar135 = vcmpps_avx512vl(auVar99,auVar91,4);
          bVar61 = bVar61 & (byte)uVar135;
          if (bVar61 != 0) {
            fVar159 = auVar88._0_4_ * fVar164;
            fVar162 = auVar88._4_4_ * fVar167;
            auVar31._4_4_ = fVar162;
            auVar31._0_4_ = fVar159;
            fVar63 = auVar88._8_4_ * fVar168;
            auVar31._8_4_ = fVar63;
            fVar64 = auVar88._12_4_ * fVar160;
            auVar31._12_4_ = fVar64;
            fVar121 = auVar88._16_4_ * 0.0;
            auVar31._16_4_ = fVar121;
            fVar122 = auVar88._20_4_ * 0.0;
            auVar31._20_4_ = fVar122;
            fVar123 = auVar88._24_4_ * 0.0;
            auVar31._24_4_ = fVar123;
            auVar31._28_4_ = auVar99._28_4_;
            auVar100 = vsubps_avx512vl(auVar90,auVar31);
            local_260._0_4_ =
                 (float)((uint)(bVar52 & 1) * (int)fVar159 |
                        (uint)!(bool)(bVar52 & 1) * auVar100._0_4_);
            bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
            local_260._4_4_ = (float)((uint)bVar56 * (int)fVar162 | (uint)!bVar56 * auVar100._4_4_);
            bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
            local_260._8_4_ = (float)((uint)bVar56 * (int)fVar63 | (uint)!bVar56 * auVar100._8_4_);
            bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
            local_260._12_4_ = (float)((uint)bVar56 * (int)fVar64 | (uint)!bVar56 * auVar100._12_4_)
            ;
            bVar56 = (bool)((byte)(uVar62 >> 4) & 1);
            local_260._16_4_ =
                 (float)((uint)bVar56 * (int)fVar121 | (uint)!bVar56 * auVar100._16_4_);
            bVar56 = (bool)((byte)(uVar62 >> 5) & 1);
            local_260._20_4_ =
                 (float)((uint)bVar56 * (int)fVar122 | (uint)!bVar56 * auVar100._20_4_);
            bVar56 = (bool)((byte)(uVar62 >> 6) & 1);
            local_260._24_4_ =
                 (float)((uint)bVar56 * (int)fVar123 | (uint)!bVar56 * auVar100._24_4_);
            bVar56 = SUB81(uVar62 >> 7,0);
            local_260._28_4_ =
                 (float)((uint)bVar56 * auVar99._28_4_ | (uint)!bVar56 * auVar100._28_4_);
            auVar99 = vsubps_avx(ZEXT1632(auVar70),auVar92);
            auVar82 = vfmadd213ps_fma(auVar99,local_260,auVar92);
            uVar129 = *(undefined4 *)((long)local_5b0->ray_space + k * 4 + -0x10);
            auVar92._4_4_ = uVar129;
            auVar92._0_4_ = uVar129;
            auVar92._8_4_ = uVar129;
            auVar92._12_4_ = uVar129;
            auVar92._16_4_ = uVar129;
            auVar92._20_4_ = uVar129;
            auVar92._24_4_ = uVar129;
            auVar92._28_4_ = uVar129;
            auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                         CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                  CONCAT44(auVar82._4_4_ +
                                                                           auVar82._4_4_,
                                                                           auVar82._0_4_ +
                                                                           auVar82._0_4_)))),auVar92
                                     );
            uVar135 = vcmpps_avx512vl(local_220,auVar99,6);
            if (((byte)uVar135 & bVar61) != 0) {
              auVar148._0_4_ = auVar89._0_4_ * fVar164;
              auVar148._4_4_ = auVar89._4_4_ * fVar167;
              auVar148._8_4_ = auVar89._8_4_ * fVar168;
              auVar148._12_4_ = auVar89._12_4_ * fVar160;
              auVar148._16_4_ = auVar89._16_4_ * 0.0;
              auVar148._20_4_ = auVar89._20_4_ * 0.0;
              auVar148._24_4_ = auVar89._24_4_ * 0.0;
              auVar148._28_4_ = 0;
              auVar99 = vsubps_avx512vl(auVar90,auVar148);
              auVar109._0_4_ =
                   (uint)(bVar52 & 1) * (int)auVar148._0_4_ |
                   (uint)!(bool)(bVar52 & 1) * auVar99._0_4_;
              bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
              auVar109._4_4_ = (uint)bVar56 * (int)auVar148._4_4_ | (uint)!bVar56 * auVar99._4_4_;
              bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
              auVar109._8_4_ = (uint)bVar56 * (int)auVar148._8_4_ | (uint)!bVar56 * auVar99._8_4_;
              bVar56 = (bool)((byte)(uVar62 >> 3) & 1);
              auVar109._12_4_ = (uint)bVar56 * (int)auVar148._12_4_ | (uint)!bVar56 * auVar99._12_4_
              ;
              bVar56 = (bool)((byte)(uVar62 >> 4) & 1);
              auVar109._16_4_ = (uint)bVar56 * (int)auVar148._16_4_ | (uint)!bVar56 * auVar99._16_4_
              ;
              bVar56 = (bool)((byte)(uVar62 >> 5) & 1);
              auVar109._20_4_ = (uint)bVar56 * (int)auVar148._20_4_ | (uint)!bVar56 * auVar99._20_4_
              ;
              bVar56 = (bool)((byte)(uVar62 >> 6) & 1);
              auVar109._24_4_ = (uint)bVar56 * (int)auVar148._24_4_ | (uint)!bVar56 * auVar99._24_4_
              ;
              auVar109._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar99._28_4_;
              auVar23._8_4_ = 0x40000000;
              auVar23._0_8_ = 0x4000000040000000;
              auVar23._12_4_ = 0x40000000;
              auVar23._16_4_ = 0x40000000;
              auVar23._20_4_ = 0x40000000;
              auVar23._24_4_ = 0x40000000;
              auVar23._28_4_ = 0x40000000;
              local_240 = vfmsub132ps_avx512vl(auVar109,auVar90,auVar23);
              local_200 = 0;
              local_1f0 = local_4d0._0_8_;
              uStack_1e8 = local_4d0._8_8_;
              local_1e0 = local_4e0._0_8_;
              uStack_1d8 = local_4e0._8_8_;
              local_1d0 = local_4f0._0_8_;
              uStack_1c8 = local_4f0._8_8_;
              if ((pGVar58->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((local_598->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar56 = true, pGVar58->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018aed9f;
                fVar145 = 1.0 / fVar145;
                local_1a0[0] = fVar145 * (local_260._0_4_ + 0.0);
                local_1a0[1] = fVar145 * (local_260._4_4_ + 1.0);
                local_1a0[2] = fVar145 * (local_260._8_4_ + 2.0);
                local_1a0[3] = fVar145 * (local_260._12_4_ + 3.0);
                fStack_190 = fVar145 * (local_260._16_4_ + 4.0);
                fStack_18c = fVar145 * (local_260._20_4_ + 5.0);
                fStack_188 = fVar145 * (local_260._24_4_ + 6.0);
                fStack_184 = local_260._28_4_ + 7.0;
                local_180 = local_240;
                local_160 = local_220;
                local_340 = 0;
                uVar57 = (ulong)((byte)uVar135 & bVar61);
                for (uVar62 = uVar57; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000)
                {
                  local_340 = local_340 + 1;
                }
                local_510 = vpbroadcastd_avx512vl();
                local_1fc = iVar7;
                while( true ) {
                  auVar77 = auVar191._0_16_;
                  auVar82 = auVar183._0_16_;
                  if (uVar57 == 0) break;
                  uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_2d0 = local_1a0[local_340];
                  local_2c0 = *(undefined4 *)(local_180 + local_340 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + local_340 * 4);
                  local_590.context = pRVar51->user;
                  fVar164 = 1.0 - local_2d0;
                  fVar145 = fVar164 * fVar164 * -3.0;
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * fVar164)),
                                            ZEXT416((uint)(local_2d0 * fVar164)),ZEXT416(0xc0000000)
                                           );
                  auVar79 = vfmsub132ss_fma(ZEXT416((uint)(local_2d0 * fVar164)),
                                            ZEXT416((uint)(local_2d0 * local_2d0)),
                                            ZEXT416(0x40000000));
                  fVar164 = auVar77._0_4_ * 3.0;
                  fVar167 = auVar79._0_4_ * 3.0;
                  fVar168 = local_2d0 * local_2d0 * 3.0;
                  auVar157._0_4_ = fVar168 * (float)local_350._0_4_;
                  auVar157._4_4_ = fVar168 * (float)local_350._4_4_;
                  auVar157._8_4_ = fVar168 * fStack_348;
                  auVar157._12_4_ = fVar168 * fStack_344;
                  auVar131._4_4_ = fVar167;
                  auVar131._0_4_ = fVar167;
                  auVar131._8_4_ = fVar167;
                  auVar131._12_4_ = fVar167;
                  auVar77 = vfmadd132ps_fma(auVar131,auVar157,local_4f0);
                  auVar146._4_4_ = fVar164;
                  auVar146._0_4_ = fVar164;
                  auVar146._8_4_ = fVar164;
                  auVar146._12_4_ = fVar164;
                  auVar77 = vfmadd132ps_fma(auVar146,auVar77,local_4e0);
                  auVar132._4_4_ = fVar145;
                  auVar132._0_4_ = fVar145;
                  auVar132._8_4_ = fVar145;
                  auVar132._12_4_ = fVar145;
                  auVar77 = vfmadd132ps_fma(auVar132,auVar77,local_4d0);
                  local_300 = auVar77._0_4_;
                  local_2f0 = vshufps_avx(auVar77,auVar77,0x55);
                  local_2e0 = vshufps_avx(auVar77,auVar77,0xaa);
                  local_2b0 = local_360._0_8_;
                  uStack_2a8 = local_360._8_8_;
                  local_2a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_28c = (local_590.context)->instID[0];
                  local_290 = uStack_28c;
                  uStack_288 = uStack_28c;
                  uStack_284 = uStack_28c;
                  uStack_280 = (local_590.context)->instPrimID[0];
                  uStack_27c = uStack_280;
                  uStack_278 = uStack_280;
                  uStack_274 = uStack_280;
                  local_5c0 = local_370;
                  local_590.valid = (int *)local_5c0;
                  local_590.geometryUserPtr = pGVar58->userPtr;
                  local_590.hit = (RTCHitN *)&local_300;
                  local_590.N = 4;
                  local_320 = (uint)uVar57;
                  uStack_31c = (uint)(uVar57 >> 0x20);
                  local_590.ray = (RTCRayN *)ray;
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  fStack_2cc = local_2d0;
                  fStack_2c8 = local_2d0;
                  fStack_2c4 = local_2d0;
                  uStack_2bc = local_2c0;
                  uStack_2b8 = local_2c0;
                  uStack_2b4 = local_2c0;
                  if (pGVar58->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar58->occlusionFilterN)(&local_590);
                    uVar57 = CONCAT44(uStack_31c,local_320);
                    auVar191 = ZEXT1664(local_3a0._0_16_);
                    auVar190 = ZEXT3264(local_4c0);
                    auVar188 = ZEXT3264(local_4a0);
                    auVar189 = ZEXT3264(local_400);
                    auVar187 = ZEXT3264(local_480);
                    auVar181 = ZEXT3264(local_560);
                    auVar182 = ZEXT3264(local_540);
                    auVar186 = ZEXT3264(local_3c0);
                    auVar185 = ZEXT3264(local_3e0);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar184 = ZEXT3264(auVar99);
                    auVar77 = vxorps_avx512vl(auVar82,auVar82);
                    auVar183 = ZEXT1664(auVar77);
                    uVar165 = local_420._0_4_;
                  }
                  auVar77 = auVar183._0_16_;
                  uVar62 = vptestmd_avx512vl(local_5c0,local_5c0);
                  if ((uVar62 & 0xf) != 0) {
                    p_Var10 = pRVar51->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((pRVar51->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar58->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_590);
                      uVar57 = CONCAT44(uStack_31c,local_320);
                      auVar191 = ZEXT1664(local_3a0._0_16_);
                      auVar190 = ZEXT3264(local_4c0);
                      auVar188 = ZEXT3264(local_4a0);
                      auVar189 = ZEXT3264(local_400);
                      auVar187 = ZEXT3264(local_480);
                      auVar181 = ZEXT3264(local_560);
                      auVar182 = ZEXT3264(local_540);
                      auVar186 = ZEXT3264(local_3c0);
                      auVar185 = ZEXT3264(local_3e0);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar184 = ZEXT3264(auVar99);
                      auVar77 = vxorps_avx512vl(auVar77,auVar77);
                      auVar183 = ZEXT1664(auVar77);
                      uVar165 = local_420._0_4_;
                    }
                    auVar77 = auVar191._0_16_;
                    auVar82 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                    uVar62 = vptestmd_avx512vl(local_5c0,local_5c0);
                    uVar62 = uVar62 & 0xf;
                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar56 = (bool)((byte)uVar62 & 1);
                    auVar83._0_4_ = (uint)bVar56 * auVar79._0_4_ | (uint)!bVar56 * auVar82._0_4_;
                    bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
                    auVar83._4_4_ = (uint)bVar56 * auVar79._4_4_ | (uint)!bVar56 * auVar82._4_4_;
                    bVar56 = (bool)((byte)(uVar62 >> 2) & 1);
                    auVar83._8_4_ = (uint)bVar56 * auVar79._8_4_ | (uint)!bVar56 * auVar82._8_4_;
                    bVar56 = SUB81(uVar62 >> 3,0);
                    auVar83._12_4_ = (uint)bVar56 * auVar79._12_4_ | (uint)!bVar56 * auVar82._12_4_;
                    *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar83;
                    if ((byte)uVar62 != 0) {
                      bVar56 = true;
                      goto LAB_018aed9f;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar129;
                  uVar62 = local_340 & 0x3f;
                  local_340 = 0;
                  uVar57 = uVar57 ^ 1L << uVar62;
                  for (uVar62 = uVar57; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000
                      ) {
                    local_340 = local_340 + 1;
                  }
                }
              }
            }
          }
        }
        bVar56 = false;
      }
    }
LAB_018aed9f:
    if (8 < iVar7) {
      local_3a0 = vpbroadcastd_avx512vl();
      local_420 = vbroadcastss_avx512vl(auVar77);
      fStack_338 = 1.0 / (float)local_500._0_4_;
      local_500 = vpbroadcastd_avx512vl();
      fStack_334 = fStack_338;
      fStack_330 = fStack_338;
      fStack_32c = fStack_338;
      fStack_328 = fStack_338;
      fStack_324 = fStack_338;
      local_320 = uVar165;
      uStack_31c = uVar165;
      uStack_318 = uVar165;
      uStack_314 = uVar165;
      uStack_310 = uVar165;
      uStack_30c = uVar165;
      uStack_308 = uVar165;
      uStack_304 = uVar165;
      local_340._0_4_ = fStack_338;
      local_340._4_4_ = fStack_338;
      for (lVar60 = 8; lVar60 < iVar7; lVar60 = lVar60 + 8) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar85 = vpor_avx2(auVar99,_DAT_01fb4ba0);
        uVar20 = vpcmpd_avx512vl(auVar85,local_3a0,1);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 * 4 + lVar53);
        auVar100 = *(undefined1 (*) [32])(lVar53 + 0x21fb768 + lVar60 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar53 + 0x21fbbec + lVar60 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar53 + 0x21fc070 + lVar60 * 4);
        local_4a0 = auVar188._0_32_;
        auVar86 = vmulps_avx512vl(local_4a0,auVar97);
        local_4c0 = auVar190._0_32_;
        auVar96 = vmulps_avx512vl(local_4c0,auVar97);
        auVar32._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
        auVar32._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
        auVar32._8_4_ = auVar97._8_4_ * fStack_d8;
        auVar32._12_4_ = auVar97._12_4_ * fStack_d4;
        auVar32._16_4_ = auVar97._16_4_ * fStack_d0;
        auVar32._20_4_ = auVar97._20_4_ * fStack_cc;
        auVar32._24_4_ = auVar97._24_4_ * fStack_c8;
        auVar32._28_4_ = auVar85._28_4_;
        local_480 = auVar187._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar86,auVar98,local_480);
        auVar104 = auVar189._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar104);
        auVar96 = vfmadd231ps_avx512vl(auVar32,auVar98,local_c0);
        auVar102 = auVar182._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar102);
        auVar101 = auVar181._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar101);
        auVar77 = vfmadd231ps_fma(auVar96,auVar100,local_a0);
        auVar103 = auVar185._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar103);
        local_3c0 = auVar186._0_32_;
        auVar90 = vfmadd231ps_avx512vl(auVar86,auVar99,local_3c0);
        auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 * 4 + lVar53);
        auVar86 = *(undefined1 (*) [32])(lVar53 + 0x21fdb88 + lVar60 * 4);
        auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar99,local_80);
        auVar96 = *(undefined1 (*) [32])(lVar53 + 0x21fe00c + lVar60 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar53 + 0x21fe490 + lVar60 * 4);
        auVar87 = vmulps_avx512vl(local_4a0,auVar95);
        auVar88 = vmulps_avx512vl(local_4c0,auVar95);
        auVar33._4_4_ = auVar95._4_4_ * (float)local_e0._4_4_;
        auVar33._0_4_ = auVar95._0_4_ * (float)local_e0._0_4_;
        auVar33._8_4_ = auVar95._8_4_ * fStack_d8;
        auVar33._12_4_ = auVar95._12_4_ * fStack_d4;
        auVar33._16_4_ = auVar95._16_4_ * fStack_d0;
        auVar33._20_4_ = auVar95._20_4_ * fStack_cc;
        auVar33._24_4_ = auVar95._24_4_ * fStack_c8;
        auVar33._28_4_ = uStack_c4;
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,local_480);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar96,auVar104);
        auVar91 = vfmadd231ps_avx512vl(auVar33,auVar96,local_c0);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar102);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar101);
        auVar82 = vfmadd231ps_fma(auVar91,auVar86,local_a0);
        auVar91 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar103);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar85,local_3c0);
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar85,local_80);
        auVar93 = vmaxps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar82));
        auVar87 = vsubps_avx(auVar91,auVar89);
        auVar88 = vsubps_avx(auVar92,auVar90);
        auVar94 = vmulps_avx512vl(auVar90,auVar87);
        auVar110 = vmulps_avx512vl(auVar89,auVar88);
        auVar94 = vsubps_avx512vl(auVar94,auVar110);
        auVar110 = vmulps_avx512vl(auVar88,auVar88);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar87,auVar87);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        auVar93 = vmulps_avx512vl(auVar93,auVar110);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        uVar135 = vcmpps_avx512vl(auVar94,auVar93,2);
        bVar61 = (byte)uVar20 & (byte)uVar135;
        if (bVar61 == 0) {
          auVar182 = ZEXT3264(auVar102);
          auVar181 = ZEXT3264(auVar101);
        }
        else {
          auVar95 = vmulps_avx512vl(local_460,auVar95);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar95);
          auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar96);
          auVar85 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
          auVar97 = vmulps_avx512vl(local_460,auVar97);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar98);
          auVar86 = vfmadd213ps_avx512vl(auVar99,local_100,auVar100);
          auVar99 = *(undefined1 (*) [32])(lVar53 + 0x21fc4f4 + lVar60 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar53 + 0x21fc978 + lVar60 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar53 + 0x21fcdfc + lVar60 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar53 + 0x21fd280 + lVar60 * 4);
          auVar96 = vmulps_avx512vl(local_4a0,auVar97);
          auVar95 = vmulps_avx512vl(local_4c0,auVar97);
          auVar97 = vmulps_avx512vl(local_460,auVar97);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_480);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar104);
          auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
          auVar97 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar102);
          auVar96 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_3c0);
          auVar95 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar53 + 0x21fe914 + lVar60 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar53 + 0x21ff21c + lVar60 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar53 + 0x21ff6a0 + lVar60 * 4);
          auVar93 = vmulps_avx512vl(local_4a0,auVar98);
          auVar94 = vmulps_avx512vl(local_4c0,auVar98);
          auVar98 = vmulps_avx512vl(local_460,auVar98);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_480);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar104);
          auVar98 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
          auVar100 = *(undefined1 (*) [32])(lVar53 + 0x21fed98 + lVar60 * 4);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar102);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar103);
          auVar93 = vfmadd231ps_avx512vl(auVar94,auVar99,local_3c0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar97,auVar94);
          vandps_avx512vl(auVar96,auVar94);
          auVar99 = vmaxps_avx(auVar94,auVar94);
          vandps_avx512vl(auVar95,auVar94);
          auVar99 = vmaxps_avx(auVar99,auVar94);
          uVar62 = vcmpps_avx512vl(auVar99,local_420,1);
          bVar11 = (bool)((byte)uVar62 & 1);
          auVar111._0_4_ = (float)((uint)bVar11 * auVar87._0_4_ | (uint)!bVar11 * auVar97._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar111._4_4_ = (float)((uint)bVar11 * auVar87._4_4_ | (uint)!bVar11 * auVar97._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar111._8_4_ = (float)((uint)bVar11 * auVar87._8_4_ | (uint)!bVar11 * auVar97._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar111._12_4_ = (float)((uint)bVar11 * auVar87._12_4_ | (uint)!bVar11 * auVar97._12_4_);
          bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar111._16_4_ = (float)((uint)bVar11 * auVar87._16_4_ | (uint)!bVar11 * auVar97._16_4_);
          bVar11 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar111._20_4_ = (float)((uint)bVar11 * auVar87._20_4_ | (uint)!bVar11 * auVar97._20_4_);
          bVar11 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar111._24_4_ = (float)((uint)bVar11 * auVar87._24_4_ | (uint)!bVar11 * auVar97._24_4_);
          bVar11 = SUB81(uVar62 >> 7,0);
          auVar111._28_4_ = (uint)bVar11 * auVar87._28_4_ | (uint)!bVar11 * auVar97._28_4_;
          bVar11 = (bool)((byte)uVar62 & 1);
          auVar112._0_4_ = (float)((uint)bVar11 * auVar88._0_4_ | (uint)!bVar11 * auVar96._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar11 * auVar88._4_4_ | (uint)!bVar11 * auVar96._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar11 * auVar88._8_4_ | (uint)!bVar11 * auVar96._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar11 * auVar88._12_4_ | (uint)!bVar11 * auVar96._12_4_);
          bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar11 * auVar88._16_4_ | (uint)!bVar11 * auVar96._16_4_);
          bVar11 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar11 * auVar88._20_4_ | (uint)!bVar11 * auVar96._20_4_);
          bVar11 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar11 * auVar88._24_4_ | (uint)!bVar11 * auVar96._24_4_);
          bVar11 = SUB81(uVar62 >> 7,0);
          auVar112._28_4_ = (uint)bVar11 * auVar88._28_4_ | (uint)!bVar11 * auVar96._28_4_;
          vandps_avx512vl(auVar98,auVar94);
          vandps_avx512vl(auVar93,auVar94);
          auVar99 = vmaxps_avx(auVar112,auVar112);
          vandps_avx512vl(auVar100,auVar94);
          auVar99 = vmaxps_avx(auVar99,auVar112);
          uVar62 = vcmpps_avx512vl(auVar99,local_420,1);
          bVar11 = (bool)((byte)uVar62 & 1);
          auVar113._0_4_ = (uint)bVar11 * auVar87._0_4_ | (uint)!bVar11 * auVar98._0_4_;
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar113._4_4_ = (uint)bVar11 * auVar87._4_4_ | (uint)!bVar11 * auVar98._4_4_;
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar113._8_4_ = (uint)bVar11 * auVar87._8_4_ | (uint)!bVar11 * auVar98._8_4_;
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar113._12_4_ = (uint)bVar11 * auVar87._12_4_ | (uint)!bVar11 * auVar98._12_4_;
          bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar113._16_4_ = (uint)bVar11 * auVar87._16_4_ | (uint)!bVar11 * auVar98._16_4_;
          bVar11 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar113._20_4_ = (uint)bVar11 * auVar87._20_4_ | (uint)!bVar11 * auVar98._20_4_;
          bVar11 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar113._24_4_ = (uint)bVar11 * auVar87._24_4_ | (uint)!bVar11 * auVar98._24_4_;
          bVar11 = SUB81(uVar62 >> 7,0);
          auVar113._28_4_ = (uint)bVar11 * auVar87._28_4_ | (uint)!bVar11 * auVar98._28_4_;
          bVar11 = (bool)((byte)uVar62 & 1);
          auVar114._0_4_ = (float)((uint)bVar11 * auVar88._0_4_ | (uint)!bVar11 * auVar93._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar11 * auVar88._4_4_ | (uint)!bVar11 * auVar93._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar11 * auVar88._8_4_ | (uint)!bVar11 * auVar93._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar11 * auVar88._12_4_ | (uint)!bVar11 * auVar93._12_4_);
          bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar11 * auVar88._16_4_ | (uint)!bVar11 * auVar93._16_4_);
          bVar11 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar11 * auVar88._20_4_ | (uint)!bVar11 * auVar93._20_4_);
          bVar11 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar11 * auVar88._24_4_ | (uint)!bVar11 * auVar93._24_4_);
          bVar11 = SUB81(uVar62 >> 7,0);
          auVar114._28_4_ = (uint)bVar11 * auVar88._28_4_ | (uint)!bVar11 * auVar93._28_4_;
          auVar170._8_4_ = 0x80000000;
          auVar170._0_8_ = 0x8000000080000000;
          auVar170._12_4_ = 0x80000000;
          auVar170._16_4_ = 0x80000000;
          auVar170._20_4_ = 0x80000000;
          auVar170._24_4_ = 0x80000000;
          auVar170._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar113,auVar170);
          auVar93 = auVar183._0_32_;
          auVar100 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar93);
          auVar79 = vfmadd231ps_fma(auVar100,auVar112,auVar112);
          auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
          auVar180._8_4_ = 0xbf000000;
          auVar180._0_8_ = 0xbf000000bf000000;
          auVar180._12_4_ = 0xbf000000;
          auVar180._16_4_ = 0xbf000000;
          auVar180._20_4_ = 0xbf000000;
          auVar180._24_4_ = 0xbf000000;
          auVar180._28_4_ = 0xbf000000;
          fVar145 = auVar100._0_4_;
          fVar164 = auVar100._4_4_;
          fVar167 = auVar100._8_4_;
          fVar168 = auVar100._12_4_;
          fVar160 = auVar100._16_4_;
          fVar159 = auVar100._20_4_;
          fVar162 = auVar100._24_4_;
          auVar34._4_4_ = fVar164 * fVar164 * fVar164 * auVar79._4_4_ * -0.5;
          auVar34._0_4_ = fVar145 * fVar145 * fVar145 * auVar79._0_4_ * -0.5;
          auVar34._8_4_ = fVar167 * fVar167 * fVar167 * auVar79._8_4_ * -0.5;
          auVar34._12_4_ = fVar168 * fVar168 * fVar168 * auVar79._12_4_ * -0.5;
          auVar34._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar34._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
          auVar34._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
          auVar34._28_4_ = auVar112._28_4_;
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar100 = vfmadd231ps_avx512vl(auVar34,auVar98,auVar100);
          auVar35._4_4_ = auVar112._4_4_ * auVar100._4_4_;
          auVar35._0_4_ = auVar112._0_4_ * auVar100._0_4_;
          auVar35._8_4_ = auVar112._8_4_ * auVar100._8_4_;
          auVar35._12_4_ = auVar112._12_4_ * auVar100._12_4_;
          auVar35._16_4_ = auVar112._16_4_ * auVar100._16_4_;
          auVar35._20_4_ = auVar112._20_4_ * auVar100._20_4_;
          auVar35._24_4_ = auVar112._24_4_ * auVar100._24_4_;
          auVar35._28_4_ = 0;
          auVar36._4_4_ = auVar100._4_4_ * -auVar111._4_4_;
          auVar36._0_4_ = auVar100._0_4_ * -auVar111._0_4_;
          auVar36._8_4_ = auVar100._8_4_ * -auVar111._8_4_;
          auVar36._12_4_ = auVar100._12_4_ * -auVar111._12_4_;
          auVar36._16_4_ = auVar100._16_4_ * -auVar111._16_4_;
          auVar36._20_4_ = auVar100._20_4_ * -auVar111._20_4_;
          auVar36._24_4_ = auVar100._24_4_ * -auVar111._24_4_;
          auVar36._28_4_ = auVar112._28_4_;
          auVar97 = vmulps_avx512vl(auVar100,auVar93);
          auVar100 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar93);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar114,auVar114);
          auVar96 = vrsqrt14ps_avx512vl(auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar180);
          fVar145 = auVar96._0_4_;
          fVar164 = auVar96._4_4_;
          fVar167 = auVar96._8_4_;
          fVar168 = auVar96._12_4_;
          fVar160 = auVar96._16_4_;
          fVar159 = auVar96._20_4_;
          fVar162 = auVar96._24_4_;
          auVar37._4_4_ = fVar164 * fVar164 * fVar164 * auVar100._4_4_;
          auVar37._0_4_ = fVar145 * fVar145 * fVar145 * auVar100._0_4_;
          auVar37._8_4_ = fVar167 * fVar167 * fVar167 * auVar100._8_4_;
          auVar37._12_4_ = fVar168 * fVar168 * fVar168 * auVar100._12_4_;
          auVar37._16_4_ = fVar160 * fVar160 * fVar160 * auVar100._16_4_;
          auVar37._20_4_ = fVar159 * fVar159 * fVar159 * auVar100._20_4_;
          auVar37._24_4_ = fVar162 * fVar162 * fVar162 * auVar100._24_4_;
          auVar37._28_4_ = auVar100._28_4_;
          auVar100 = vfmadd231ps_avx512vl(auVar37,auVar98,auVar96);
          auVar38._4_4_ = auVar114._4_4_ * auVar100._4_4_;
          auVar38._0_4_ = auVar114._0_4_ * auVar100._0_4_;
          auVar38._8_4_ = auVar114._8_4_ * auVar100._8_4_;
          auVar38._12_4_ = auVar114._12_4_ * auVar100._12_4_;
          auVar38._16_4_ = auVar114._16_4_ * auVar100._16_4_;
          auVar38._20_4_ = auVar114._20_4_ * auVar100._20_4_;
          auVar38._24_4_ = auVar114._24_4_ * auVar100._24_4_;
          auVar38._28_4_ = auVar96._28_4_;
          auVar39._4_4_ = auVar100._4_4_ * auVar99._4_4_;
          auVar39._0_4_ = auVar100._0_4_ * auVar99._0_4_;
          auVar39._8_4_ = auVar100._8_4_ * auVar99._8_4_;
          auVar39._12_4_ = auVar100._12_4_ * auVar99._12_4_;
          auVar39._16_4_ = auVar100._16_4_ * auVar99._16_4_;
          auVar39._20_4_ = auVar100._20_4_ * auVar99._20_4_;
          auVar39._24_4_ = auVar100._24_4_ * auVar99._24_4_;
          auVar39._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar100,auVar93);
          auVar79 = vfmadd213ps_fma(auVar35,ZEXT1632(auVar77),auVar89);
          auVar100 = ZEXT1632(auVar77);
          auVar78 = vfmadd213ps_fma(auVar36,auVar100,auVar90);
          auVar98 = vfmadd213ps_avx512vl(auVar97,auVar100,auVar86);
          auVar96 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar82),auVar91);
          auVar70 = vfnmadd213ps_fma(auVar35,auVar100,auVar89);
          auVar95 = ZEXT1632(auVar82);
          auVar6 = vfmadd213ps_fma(auVar39,auVar95,auVar92);
          auVar71 = vfnmadd213ps_fma(auVar36,auVar100,auVar90);
          auVar17 = vfmadd213ps_fma(auVar99,auVar95,auVar85);
          auVar90 = ZEXT1632(auVar77);
          auVar75 = vfnmadd231ps_fma(auVar86,auVar90,auVar97);
          auVar72 = vfnmadd213ps_fma(auVar38,auVar95,auVar91);
          auVar74 = vfnmadd213ps_fma(auVar39,auVar95,auVar92);
          auVar76 = vfnmadd231ps_fma(auVar85,ZEXT1632(auVar82),auVar99);
          auVar85 = vsubps_avx512vl(auVar96,ZEXT1632(auVar70));
          auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar71));
          auVar100 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar75));
          auVar40._4_4_ = auVar99._4_4_ * auVar75._4_4_;
          auVar40._0_4_ = auVar99._0_4_ * auVar75._0_4_;
          auVar40._8_4_ = auVar99._8_4_ * auVar75._8_4_;
          auVar40._12_4_ = auVar99._12_4_ * auVar75._12_4_;
          auVar40._16_4_ = auVar99._16_4_ * 0.0;
          auVar40._20_4_ = auVar99._20_4_ * 0.0;
          auVar40._24_4_ = auVar99._24_4_ * 0.0;
          auVar40._28_4_ = auVar97._28_4_;
          auVar77 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar71),auVar100);
          auVar41._4_4_ = auVar100._4_4_ * auVar70._4_4_;
          auVar41._0_4_ = auVar100._0_4_ * auVar70._0_4_;
          auVar41._8_4_ = auVar100._8_4_ * auVar70._8_4_;
          auVar41._12_4_ = auVar100._12_4_ * auVar70._12_4_;
          auVar41._16_4_ = auVar100._16_4_ * 0.0;
          auVar41._20_4_ = auVar100._20_4_ * 0.0;
          auVar41._24_4_ = auVar100._24_4_ * 0.0;
          auVar41._28_4_ = auVar100._28_4_;
          auVar73 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar75),auVar85);
          auVar42._4_4_ = auVar71._4_4_ * auVar85._4_4_;
          auVar42._0_4_ = auVar71._0_4_ * auVar85._0_4_;
          auVar42._8_4_ = auVar71._8_4_ * auVar85._8_4_;
          auVar42._12_4_ = auVar71._12_4_ * auVar85._12_4_;
          auVar42._16_4_ = auVar85._16_4_ * 0.0;
          auVar42._20_4_ = auVar85._20_4_ * 0.0;
          auVar42._24_4_ = auVar85._24_4_ * 0.0;
          auVar42._28_4_ = auVar85._28_4_;
          auVar69 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar70),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar69),auVar93,ZEXT1632(auVar73));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar77));
          uVar62 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar52 = (byte)uVar62;
          fVar121 = (float)((uint)(bVar52 & 1) * auVar79._0_4_ |
                           (uint)!(bool)(bVar52 & 1) * auVar72._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar123 = (float)((uint)bVar11 * auVar79._4_4_ | (uint)!bVar11 * auVar72._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar125 = (float)((uint)bVar11 * auVar79._8_4_ | (uint)!bVar11 * auVar72._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar127 = (float)((uint)bVar11 * auVar79._12_4_ | (uint)!bVar11 * auVar72._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar125,CONCAT44(fVar123,fVar121))));
          fVar122 = (float)((uint)(bVar52 & 1) * auVar78._0_4_ |
                           (uint)!(bool)(bVar52 & 1) * auVar74._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar124 = (float)((uint)bVar11 * auVar78._4_4_ | (uint)!bVar11 * auVar74._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar126 = (float)((uint)bVar11 * auVar78._8_4_ | (uint)!bVar11 * auVar74._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar128 = (float)((uint)bVar11 * auVar78._12_4_ | (uint)!bVar11 * auVar74._12_4_);
          auVar87 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar122))));
          auVar115._0_4_ =
               (float)((uint)(bVar52 & 1) * auVar98._0_4_ |
                      (uint)!(bool)(bVar52 & 1) * auVar76._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar11 * auVar98._4_4_ | (uint)!bVar11 * auVar76._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar11 * auVar98._8_4_ | (uint)!bVar11 * auVar76._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar11 * auVar98._12_4_ | (uint)!bVar11 * auVar76._12_4_);
          fVar164 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_);
          auVar115._16_4_ = fVar164;
          fVar167 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_);
          auVar115._20_4_ = fVar167;
          fVar145 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_);
          auVar115._24_4_ = fVar145;
          iVar1 = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
          auVar115._28_4_ = iVar1;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar70),auVar96);
          auVar116._0_4_ =
               (uint)(bVar52 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar77._0_4_;
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar77._4_4_;
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar77._8_4_;
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar77._12_4_;
          auVar116._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar99._16_4_;
          auVar116._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar99._20_4_;
          auVar116._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar99._24_4_;
          auVar116._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar71),ZEXT1632(auVar6));
          auVar117._0_4_ =
               (float)((uint)(bVar52 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar52 & 1) * auVar79._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar79._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar79._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar79._12_4_);
          fVar168 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar99._16_4_);
          auVar117._16_4_ = fVar168;
          fVar160 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar99._20_4_);
          auVar117._20_4_ = fVar160;
          fVar159 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar99._24_4_);
          auVar117._24_4_ = fVar159;
          auVar117._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar17));
          auVar118._0_4_ =
               (float)((uint)(bVar52 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar52 & 1) * auVar78._0_4_);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar78._4_4_);
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar78._8_4_);
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar78._12_4_);
          fVar64 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar99._16_4_);
          auVar118._16_4_ = fVar64;
          fVar162 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar99._20_4_);
          auVar118._20_4_ = fVar162;
          fVar63 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar99._24_4_);
          auVar118._24_4_ = fVar63;
          iVar2 = (uint)(byte)(uVar62 >> 7) * auVar99._28_4_;
          auVar118._28_4_ = iVar2;
          auVar119._0_4_ =
               (uint)(bVar52 & 1) * (int)auVar70._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar96._0_4_;
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar11 * (int)auVar70._4_4_ | (uint)!bVar11 * auVar96._4_4_;
          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar11 * (int)auVar70._8_4_ | (uint)!bVar11 * auVar96._8_4_;
          bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar11 * (int)auVar70._12_4_ | (uint)!bVar11 * auVar96._12_4_;
          auVar119._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar96._16_4_;
          auVar119._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar96._20_4_;
          auVar119._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar96._24_4_;
          auVar119._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar96._28_4_;
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar62 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar96 = vsubps_avx512vl(auVar119,auVar95);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar71._12_4_ |
                                                   (uint)!bVar15 * auVar6._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar71._8_4_ |
                                                            (uint)!bVar14 * auVar6._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar71._4_4_ |
                                                                     (uint)!bVar11 * auVar6._4_4_,
                                                                     (uint)(bVar52 & 1) *
                                                                     (int)auVar71._0_4_ |
                                                                     (uint)!(bool)(bVar52 & 1) *
                                                                     auVar6._0_4_)))),auVar87);
          auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar75._12_4_ |
                                                  (uint)!bVar16 * auVar17._12_4_,
                                                  CONCAT48((uint)bVar13 * (int)auVar75._8_4_ |
                                                           (uint)!bVar13 * auVar17._8_4_,
                                                           CONCAT44((uint)bVar12 *
                                                                    (int)auVar75._4_4_ |
                                                                    (uint)!bVar12 * auVar17._4_4_,
                                                                    (uint)(bVar52 & 1) *
                                                                    (int)auVar75._0_4_ |
                                                                    (uint)!(bool)(bVar52 & 1) *
                                                                    auVar17._0_4_)))),auVar115);
          auVar97 = vsubps_avx(auVar95,auVar116);
          auVar85 = vsubps_avx(auVar87,auVar117);
          auVar86 = vsubps_avx(auVar115,auVar118);
          auVar43._4_4_ = auVar98._4_4_ * fVar123;
          auVar43._0_4_ = auVar98._0_4_ * fVar121;
          auVar43._8_4_ = auVar98._8_4_ * fVar125;
          auVar43._12_4_ = auVar98._12_4_ * fVar127;
          auVar43._16_4_ = auVar98._16_4_ * 0.0;
          auVar43._20_4_ = auVar98._20_4_ * 0.0;
          auVar43._24_4_ = auVar98._24_4_ * 0.0;
          auVar43._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar43,auVar115,auVar96);
          auVar149._0_4_ = fVar122 * auVar96._0_4_;
          auVar149._4_4_ = fVar124 * auVar96._4_4_;
          auVar149._8_4_ = fVar126 * auVar96._8_4_;
          auVar149._12_4_ = fVar128 * auVar96._12_4_;
          auVar149._16_4_ = auVar96._16_4_ * 0.0;
          auVar149._20_4_ = auVar96._20_4_ * 0.0;
          auVar149._24_4_ = auVar96._24_4_ * 0.0;
          auVar149._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar149,auVar95,auVar100);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar93,ZEXT1632(auVar77));
          auVar153._0_4_ = auVar100._0_4_ * auVar115._0_4_;
          auVar153._4_4_ = auVar100._4_4_ * auVar115._4_4_;
          auVar153._8_4_ = auVar100._8_4_ * auVar115._8_4_;
          auVar153._12_4_ = auVar100._12_4_ * auVar115._12_4_;
          auVar153._16_4_ = auVar100._16_4_ * fVar164;
          auVar153._20_4_ = auVar100._20_4_ * fVar167;
          auVar153._24_4_ = auVar100._24_4_ * fVar145;
          auVar153._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar153,auVar87,auVar98);
          auVar88 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar77));
          auVar99 = vmulps_avx512vl(auVar86,auVar116);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar118);
          auVar44._4_4_ = auVar85._4_4_ * auVar118._4_4_;
          auVar44._0_4_ = auVar85._0_4_ * auVar118._0_4_;
          auVar44._8_4_ = auVar85._8_4_ * auVar118._8_4_;
          auVar44._12_4_ = auVar85._12_4_ * auVar118._12_4_;
          auVar44._16_4_ = auVar85._16_4_ * fVar64;
          auVar44._20_4_ = auVar85._20_4_ * fVar162;
          auVar44._24_4_ = auVar85._24_4_ * fVar63;
          auVar44._28_4_ = iVar2;
          auVar77 = vfmsub231ps_fma(auVar44,auVar117,auVar86);
          auVar154._0_4_ = auVar117._0_4_ * auVar97._0_4_;
          auVar154._4_4_ = auVar117._4_4_ * auVar97._4_4_;
          auVar154._8_4_ = auVar117._8_4_ * auVar97._8_4_;
          auVar154._12_4_ = auVar117._12_4_ * auVar97._12_4_;
          auVar154._16_4_ = fVar168 * auVar97._16_4_;
          auVar154._20_4_ = fVar160 * auVar97._20_4_;
          auVar154._24_4_ = fVar159 * auVar97._24_4_;
          auVar154._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar154,auVar85,auVar116);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar93,auVar99);
          auVar89 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar77));
          auVar99 = vmaxps_avx(auVar88,auVar89);
          uVar135 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar61 = bVar61 & (byte)uVar135;
          if (bVar61 != 0) {
            auVar45._4_4_ = auVar86._4_4_ * auVar100._4_4_;
            auVar45._0_4_ = auVar86._0_4_ * auVar100._0_4_;
            auVar45._8_4_ = auVar86._8_4_ * auVar100._8_4_;
            auVar45._12_4_ = auVar86._12_4_ * auVar100._12_4_;
            auVar45._16_4_ = auVar86._16_4_ * auVar100._16_4_;
            auVar45._20_4_ = auVar86._20_4_ * auVar100._20_4_;
            auVar45._24_4_ = auVar86._24_4_ * auVar100._24_4_;
            auVar45._28_4_ = auVar99._28_4_;
            auVar78 = vfmsub231ps_fma(auVar45,auVar85,auVar98);
            auVar46._4_4_ = auVar98._4_4_ * auVar97._4_4_;
            auVar46._0_4_ = auVar98._0_4_ * auVar97._0_4_;
            auVar46._8_4_ = auVar98._8_4_ * auVar97._8_4_;
            auVar46._12_4_ = auVar98._12_4_ * auVar97._12_4_;
            auVar46._16_4_ = auVar98._16_4_ * auVar97._16_4_;
            auVar46._20_4_ = auVar98._20_4_ * auVar97._20_4_;
            auVar46._24_4_ = auVar98._24_4_ * auVar97._24_4_;
            auVar46._28_4_ = auVar98._28_4_;
            auVar79 = vfmsub231ps_fma(auVar46,auVar96,auVar86);
            auVar47._4_4_ = auVar85._4_4_ * auVar96._4_4_;
            auVar47._0_4_ = auVar85._0_4_ * auVar96._0_4_;
            auVar47._8_4_ = auVar85._8_4_ * auVar96._8_4_;
            auVar47._12_4_ = auVar85._12_4_ * auVar96._12_4_;
            auVar47._16_4_ = auVar85._16_4_ * auVar96._16_4_;
            auVar47._20_4_ = auVar85._20_4_ * auVar96._20_4_;
            auVar47._24_4_ = auVar85._24_4_ * auVar96._24_4_;
            auVar47._28_4_ = auVar85._28_4_;
            auVar6 = vfmsub231ps_fma(auVar47,auVar97,auVar100);
            auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar6));
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar78),auVar93);
            auVar100 = vrcp14ps_avx512vl(auVar99);
            auVar97 = auVar184._0_32_;
            auVar98 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar97);
            auVar77 = vfmadd132ps_fma(auVar98,auVar100,auVar100);
            auVar48._4_4_ = auVar6._4_4_ * auVar115._4_4_;
            auVar48._0_4_ = auVar6._0_4_ * auVar115._0_4_;
            auVar48._8_4_ = auVar6._8_4_ * auVar115._8_4_;
            auVar48._12_4_ = auVar6._12_4_ * auVar115._12_4_;
            auVar48._16_4_ = fVar164 * 0.0;
            auVar48._20_4_ = fVar167 * 0.0;
            auVar48._24_4_ = fVar145 * 0.0;
            auVar48._28_4_ = iVar1;
            auVar79 = vfmadd231ps_fma(auVar48,auVar87,ZEXT1632(auVar79));
            auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar95,ZEXT1632(auVar78));
            fVar145 = auVar77._0_4_;
            fVar164 = auVar77._4_4_;
            fVar167 = auVar77._8_4_;
            fVar168 = auVar77._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar168,
                                           CONCAT48(auVar79._8_4_ * fVar167,
                                                    CONCAT44(auVar79._4_4_ * fVar164,
                                                             auVar79._0_4_ * fVar145))));
            auVar50._4_4_ = uStack_31c;
            auVar50._0_4_ = local_320;
            auVar50._8_4_ = uStack_318;
            auVar50._12_4_ = uStack_314;
            auVar50._16_4_ = uStack_310;
            auVar50._20_4_ = uStack_30c;
            auVar50._24_4_ = uStack_308;
            auVar50._28_4_ = uStack_304;
            uVar135 = vcmpps_avx512vl(local_220,auVar50,0xd);
            uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar24._4_4_ = uVar129;
            auVar24._0_4_ = uVar129;
            auVar24._8_4_ = uVar129;
            auVar24._12_4_ = uVar129;
            auVar24._16_4_ = uVar129;
            auVar24._20_4_ = uVar129;
            auVar24._24_4_ = uVar129;
            auVar24._28_4_ = uVar129;
            uVar20 = vcmpps_avx512vl(local_220,auVar24,2);
            bVar61 = (byte)uVar135 & (byte)uVar20 & bVar61;
            if (bVar61 != 0) {
              uVar135 = vcmpps_avx512vl(auVar99,auVar93,4);
              bVar61 = bVar61 & (byte)uVar135;
              auVar182 = ZEXT3264(local_540);
              auVar181 = ZEXT3264(local_560);
              if (bVar61 != 0) {
                fVar160 = auVar88._0_4_ * fVar145;
                fVar159 = auVar88._4_4_ * fVar164;
                auVar49._4_4_ = fVar159;
                auVar49._0_4_ = fVar160;
                fVar162 = auVar88._8_4_ * fVar167;
                auVar49._8_4_ = fVar162;
                fVar63 = auVar88._12_4_ * fVar168;
                auVar49._12_4_ = fVar63;
                fVar64 = auVar88._16_4_ * 0.0;
                auVar49._16_4_ = fVar64;
                fVar121 = auVar88._20_4_ * 0.0;
                auVar49._20_4_ = fVar121;
                fVar122 = auVar88._24_4_ * 0.0;
                auVar49._24_4_ = fVar122;
                auVar49._28_4_ = auVar99._28_4_;
                auVar100 = vsubps_avx512vl(auVar97,auVar49);
                local_260._0_4_ =
                     (float)((uint)(bVar52 & 1) * (int)fVar160 |
                            (uint)!(bool)(bVar52 & 1) * auVar100._0_4_);
                bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar11 * (int)fVar159 | (uint)!bVar11 * auVar100._4_4_);
                bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar11 * (int)fVar162 | (uint)!bVar11 * auVar100._8_4_);
                bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar11 * (int)fVar63 | (uint)!bVar11 * auVar100._12_4_);
                bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar11 * (int)fVar64 | (uint)!bVar11 * auVar100._16_4_);
                bVar11 = (bool)((byte)(uVar62 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar11 * (int)fVar121 | (uint)!bVar11 * auVar100._20_4_);
                bVar11 = (bool)((byte)(uVar62 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar11 * (int)fVar122 | (uint)!bVar11 * auVar100._24_4_);
                bVar11 = SUB81(uVar62 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar11 * auVar99._28_4_ | (uint)!bVar11 * auVar100._28_4_);
                auVar99 = vsubps_avx(ZEXT1632(auVar82),auVar90);
                auVar77 = vfmadd213ps_fma(auVar99,local_260,auVar90);
                uVar129 = *(undefined4 *)((long)local_5b0->ray_space + k * 4 + -0x10);
                auVar25._4_4_ = uVar129;
                auVar25._0_4_ = uVar129;
                auVar25._8_4_ = uVar129;
                auVar25._12_4_ = uVar129;
                auVar25._16_4_ = uVar129;
                auVar25._20_4_ = uVar129;
                auVar25._24_4_ = uVar129;
                auVar25._28_4_ = uVar129;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                             CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                      CONCAT44(auVar77._4_4_ +
                                                                               auVar77._4_4_,
                                                                               auVar77._0_4_ +
                                                                               auVar77._0_4_)))),
                                          auVar25);
                uVar135 = vcmpps_avx512vl(local_220,auVar99,6);
                if (((byte)uVar135 & bVar61) != 0) {
                  auVar140._0_4_ = auVar89._0_4_ * fVar145;
                  auVar140._4_4_ = auVar89._4_4_ * fVar164;
                  auVar140._8_4_ = auVar89._8_4_ * fVar167;
                  auVar140._12_4_ = auVar89._12_4_ * fVar168;
                  auVar140._16_4_ = auVar89._16_4_ * 0.0;
                  auVar140._20_4_ = auVar89._20_4_ * 0.0;
                  auVar140._24_4_ = auVar89._24_4_ * 0.0;
                  auVar140._28_4_ = 0;
                  auVar99 = vsubps_avx512vl(auVar97,auVar140);
                  auVar120._0_4_ =
                       (uint)(bVar52 & 1) * (int)auVar140._0_4_ |
                       (uint)!(bool)(bVar52 & 1) * auVar99._0_4_;
                  bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
                  auVar120._4_4_ =
                       (uint)bVar11 * (int)auVar140._4_4_ | (uint)!bVar11 * auVar99._4_4_;
                  bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                  auVar120._8_4_ =
                       (uint)bVar11 * (int)auVar140._8_4_ | (uint)!bVar11 * auVar99._8_4_;
                  bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
                  auVar120._12_4_ =
                       (uint)bVar11 * (int)auVar140._12_4_ | (uint)!bVar11 * auVar99._12_4_;
                  bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
                  auVar120._16_4_ =
                       (uint)bVar11 * (int)auVar140._16_4_ | (uint)!bVar11 * auVar99._16_4_;
                  bVar11 = (bool)((byte)(uVar62 >> 5) & 1);
                  auVar120._20_4_ =
                       (uint)bVar11 * (int)auVar140._20_4_ | (uint)!bVar11 * auVar99._20_4_;
                  bVar11 = (bool)((byte)(uVar62 >> 6) & 1);
                  auVar120._24_4_ =
                       (uint)bVar11 * (int)auVar140._24_4_ | (uint)!bVar11 * auVar99._24_4_;
                  auVar120._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar99._28_4_;
                  auVar26._8_4_ = 0x40000000;
                  auVar26._0_8_ = 0x4000000040000000;
                  auVar26._12_4_ = 0x40000000;
                  auVar26._16_4_ = 0x40000000;
                  auVar26._20_4_ = 0x40000000;
                  auVar26._24_4_ = 0x40000000;
                  auVar26._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar120,auVar97,auVar26);
                  local_200 = (undefined4)lVar60;
                  local_1f0 = local_4d0._0_8_;
                  uStack_1e8 = local_4d0._8_8_;
                  local_1e0 = local_4e0._0_8_;
                  uStack_1d8 = local_4e0._8_8_;
                  local_1d0 = local_4f0._0_8_;
                  uStack_1c8 = local_4f0._8_8_;
                  pGVar58 = (pRVar51->scene->geometries).items[local_5a8].ptr;
                  if ((pGVar58->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar52 = 0;
                  }
                  else if ((pRVar51->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar52 = 1, pGVar58->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar77 = vcvtsi2ss_avx512f(auVar183._0_16_,local_200);
                    fVar145 = auVar77._0_4_;
                    local_1a0[0] = (fVar145 + local_260._0_4_ + 0.0) * (float)local_340;
                    local_1a0[1] = (fVar145 + local_260._4_4_ + 1.0) * local_340._4_4_;
                    local_1a0[2] = (fVar145 + local_260._8_4_ + 2.0) * fStack_338;
                    local_1a0[3] = (fVar145 + local_260._12_4_ + 3.0) * fStack_334;
                    fStack_190 = (fVar145 + local_260._16_4_ + 4.0) * fStack_330;
                    fStack_18c = (fVar145 + local_260._20_4_ + 5.0) * fStack_32c;
                    fStack_188 = (fVar145 + local_260._24_4_ + 6.0) * fStack_328;
                    fStack_184 = fVar145 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    uVar62 = 0;
                    uVar54 = (ulong)((byte)uVar135 & bVar61);
                    for (uVar57 = uVar54; local_5a0 = pGVar58, local_1fc = iVar7, (uVar57 & 1) == 0;
                        uVar57 = uVar57 >> 1 | 0x8000000000000000) {
                      uVar62 = uVar62 + 1;
                    }
                    while (auVar77 = auVar183._0_16_, uVar54 != 0) {
                      uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_2d0 = local_1a0[uVar62];
                      local_2c0 = *(undefined4 *)(local_180 + uVar62 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar62 * 4);
                      local_590.context = pRVar51->user;
                      fVar164 = 1.0 - local_2d0;
                      fVar145 = fVar164 * fVar164 * -3.0;
                      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * fVar164)),
                                                ZEXT416((uint)(local_2d0 * fVar164)),
                                                ZEXT416(0xc0000000));
                      auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_2d0 * fVar164)),
                                                ZEXT416((uint)(local_2d0 * local_2d0)),
                                                ZEXT416(0x40000000));
                      fVar164 = auVar77._0_4_ * 3.0;
                      fVar167 = auVar82._0_4_ * 3.0;
                      fVar168 = local_2d0 * local_2d0 * 3.0;
                      auVar158._0_4_ = fVar168 * (float)local_350._0_4_;
                      auVar158._4_4_ = fVar168 * (float)local_350._4_4_;
                      auVar158._8_4_ = fVar168 * fStack_348;
                      auVar158._12_4_ = fVar168 * fStack_344;
                      auVar133._4_4_ = fVar167;
                      auVar133._0_4_ = fVar167;
                      auVar133._8_4_ = fVar167;
                      auVar133._12_4_ = fVar167;
                      auVar77 = vfmadd132ps_fma(auVar133,auVar158,local_4f0);
                      auVar147._4_4_ = fVar164;
                      auVar147._0_4_ = fVar164;
                      auVar147._8_4_ = fVar164;
                      auVar147._12_4_ = fVar164;
                      auVar77 = vfmadd132ps_fma(auVar147,auVar77,local_4e0);
                      auVar134._4_4_ = fVar145;
                      auVar134._0_4_ = fVar145;
                      auVar134._8_4_ = fVar145;
                      auVar134._12_4_ = fVar145;
                      auVar77 = vfmadd132ps_fma(auVar134,auVar77,local_4d0);
                      local_300 = auVar77._0_4_;
                      local_2f0 = vshufps_avx(auVar77,auVar77,0x55);
                      local_2e0 = vshufps_avx(auVar77,auVar77,0xaa);
                      local_2b0 = local_360._0_8_;
                      uStack_2a8 = local_360._8_8_;
                      local_2a0 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_28c = (local_590.context)->instID[0];
                      local_290 = uStack_28c;
                      uStack_288 = uStack_28c;
                      uStack_284 = uStack_28c;
                      uStack_280 = (local_590.context)->instPrimID[0];
                      uStack_27c = uStack_280;
                      uStack_278 = uStack_280;
                      uStack_274 = uStack_280;
                      local_5c0 = local_370;
                      local_590.valid = (int *)local_5c0;
                      local_590.geometryUserPtr = pGVar58->userPtr;
                      local_590.hit = (RTCHitN *)&local_300;
                      local_590.N = 4;
                      local_510._0_8_ = uVar62;
                      uVar57 = uVar62;
                      local_590.ray = (RTCRayN *)ray;
                      uStack_2fc = local_300;
                      uStack_2f8 = local_300;
                      uStack_2f4 = local_300;
                      fStack_2cc = local_2d0;
                      fStack_2c8 = local_2d0;
                      fStack_2c4 = local_2d0;
                      uStack_2bc = local_2c0;
                      uStack_2b8 = local_2c0;
                      uStack_2b4 = local_2c0;
                      if (pGVar58->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar58->occlusionFilterN)(&local_590);
                        uVar57 = local_510._0_8_;
                        pGVar58 = local_5a0;
                      }
                      uVar62 = vptestmd_avx512vl(local_5c0,local_5c0);
                      if ((uVar62 & 0xf) != 0) {
                        p_Var10 = pRVar51->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar51->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar58->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&local_590);
                          uVar57 = local_510._0_8_;
                          pGVar58 = local_5a0;
                        }
                        auVar77 = auVar183._0_16_;
                        auVar82 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                        uVar62 = vptestmd_avx512vl(local_5c0,local_5c0);
                        uVar62 = uVar62 & 0xf;
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar11 = (bool)((byte)uVar62 & 1);
                        auVar84._0_4_ = (uint)bVar11 * auVar79._0_4_ | (uint)!bVar11 * auVar82._0_4_
                        ;
                        bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
                        auVar84._4_4_ = (uint)bVar11 * auVar79._4_4_ | (uint)!bVar11 * auVar82._4_4_
                        ;
                        bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                        auVar84._8_4_ = (uint)bVar11 * auVar79._8_4_ | (uint)!bVar11 * auVar82._8_4_
                        ;
                        bVar11 = SUB81(uVar62 >> 3,0);
                        auVar84._12_4_ =
                             (uint)bVar11 * auVar79._12_4_ | (uint)!bVar11 * auVar82._12_4_;
                        *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar84;
                        if ((byte)uVar62 != 0) {
                          bVar52 = 1;
                          goto LAB_018af802;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar129;
                      uVar62 = 0;
                      uVar54 = uVar54 ^ 1L << (uVar57 & 0x3f);
                      for (uVar57 = uVar54; (uVar57 & 1) == 0;
                          uVar57 = uVar57 >> 1 | 0x8000000000000000) {
                        uVar62 = uVar62 + 1;
                      }
                    }
                    bVar52 = 0;
LAB_018af802:
                    auVar77 = vxorps_avx512vl(auVar77,auVar77);
                    auVar183 = ZEXT1664(auVar77);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar184 = ZEXT3264(auVar99);
                    auVar185 = ZEXT3264(local_3e0);
                    auVar186 = ZEXT3264(local_3c0);
                    auVar182 = ZEXT3264(local_540);
                    auVar181 = ZEXT3264(local_560);
                    auVar187 = ZEXT3264(local_480);
                    auVar189 = ZEXT3264(local_400);
                    auVar188 = ZEXT3264(local_4a0);
                    auVar190 = ZEXT3264(local_4c0);
                  }
                  bVar56 = (bool)(bVar56 | bVar52);
                }
              }
              goto LAB_018af7e1;
            }
          }
          auVar182 = ZEXT3264(local_540);
          auVar181 = ZEXT3264(local_560);
        }
LAB_018af7e1:
      }
    }
    if (bVar56) break;
    uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar21._4_4_ = uVar129;
    auVar21._0_4_ = uVar129;
    auVar21._8_4_ = uVar129;
    auVar21._12_4_ = uVar129;
    uVar135 = vcmpps_avx512vl(local_270,auVar21,2);
    context = pRVar51;
  }
  return uVar59 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }